

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<4,16>::
     occluded_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,16,8>,embree::avx512::Occluded1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  int iVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  byte bVar59;
  ulong uVar60;
  long lVar61;
  ulong uVar62;
  ulong uVar63;
  uint uVar64;
  Geometry *geometry;
  long lVar65;
  ulong uVar66;
  byte bVar67;
  float fVar68;
  float fVar69;
  float fVar116;
  float fVar118;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  float fVar117;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  float fVar122;
  float fVar123;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  float fVar124;
  undefined4 uVar125;
  float fVar135;
  vint4 bi_2;
  undefined1 auVar126 [16];
  float fVar136;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [64];
  undefined8 uVar137;
  vint4 bi_1;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  vint4 bi;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  vint4 ai_2;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  vint4 ai_1;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar167;
  float fVar168;
  float fVar171;
  vint4 ai;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [64];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  vint<16> mask;
  float old_t_1;
  undefined1 local_940 [16];
  RTCFilterFunctionNArguments local_910;
  undefined1 local_8e0 [16];
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [16];
  LinearSpace3fa *local_8a8;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_730 [8];
  float fStack_728;
  float fStack_724;
  uint local_720;
  uint uStack_71c;
  uint uStack_718;
  uint uStack_714;
  uint uStack_710;
  uint uStack_70c;
  uint uStack_708;
  uint uStack_704;
  undefined1 local_700 [64];
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_670 [16];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined4 local_600;
  int local_5fc;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  float local_5a0 [4];
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [64];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 auStack_420 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  PVar6 = prim[1];
  uVar62 = (ulong)(byte)PVar6;
  lVar25 = uVar62 * 0x25;
  fVar124 = *(float *)(prim + lVar25 + 0x12);
  auVar74 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar74 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar73 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar73 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar74 = vsubps_avx(auVar74,*(undefined1 (*) [16])(prim + lVar25 + 6));
  auVar150._0_4_ = fVar124 * auVar74._0_4_;
  auVar150._4_4_ = fVar124 * auVar74._4_4_;
  auVar150._8_4_ = fVar124 * auVar74._8_4_;
  auVar150._12_4_ = fVar124 * auVar74._12_4_;
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 4 + 6)));
  auVar126._0_4_ = fVar124 * auVar73._0_4_;
  auVar126._4_4_ = fVar124 * auVar73._4_4_;
  auVar126._8_4_ = fVar124 * auVar73._8_4_;
  auVar126._12_4_ = fVar124 * auVar73._12_4_;
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 5 + 6)));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 6 + 6)));
  auVar190 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0xf + 6)));
  auVar191 = vcvtdq2ps_avx(auVar191);
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar62 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x1a + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x1b + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x1c + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar162._4_4_ = auVar126._0_4_;
  auVar162._0_4_ = auVar126._0_4_;
  auVar162._8_4_ = auVar126._0_4_;
  auVar162._12_4_ = auVar126._0_4_;
  auVar75 = vshufps_avx(auVar126,auVar126,0x55);
  auVar76 = vshufps_avx(auVar126,auVar126,0xaa);
  fVar124 = auVar76._0_4_;
  auVar144._0_4_ = fVar124 * auVar191._0_4_;
  fVar149 = auVar76._4_4_;
  auVar144._4_4_ = fVar149 * auVar191._4_4_;
  fVar135 = auVar76._8_4_;
  auVar144._8_4_ = fVar135 * auVar191._8_4_;
  fVar136 = auVar76._12_4_;
  auVar144._12_4_ = fVar136 * auVar191._12_4_;
  auVar138._0_4_ = auVar20._0_4_ * fVar124;
  auVar138._4_4_ = auVar20._4_4_ * fVar149;
  auVar138._8_4_ = auVar20._8_4_ * fVar135;
  auVar138._12_4_ = auVar20._12_4_ * fVar136;
  auVar127._0_4_ = auVar23._0_4_ * fVar124;
  auVar127._4_4_ = auVar23._4_4_ * fVar149;
  auVar127._8_4_ = auVar23._8_4_ * fVar135;
  auVar127._12_4_ = auVar23._12_4_ * fVar136;
  auVar76 = vfmadd231ps_fma(auVar144,auVar75,auVar73);
  auVar27 = vfmadd231ps_fma(auVar138,auVar75,auVar19);
  auVar75 = vfmadd231ps_fma(auVar127,auVar22,auVar75);
  auVar28 = vfmadd231ps_fma(auVar76,auVar162,auVar74);
  auVar27 = vfmadd231ps_fma(auVar27,auVar162,auVar190);
  auVar77 = vfmadd231ps_fma(auVar75,auVar21,auVar162);
  auVar184._4_4_ = auVar150._0_4_;
  auVar184._0_4_ = auVar150._0_4_;
  auVar184._8_4_ = auVar150._0_4_;
  auVar184._12_4_ = auVar150._0_4_;
  auVar75 = vshufps_avx(auVar150,auVar150,0x55);
  auVar76 = vshufps_avx(auVar150,auVar150,0xaa);
  fVar124 = auVar76._0_4_;
  auVar163._0_4_ = fVar124 * auVar191._0_4_;
  fVar149 = auVar76._4_4_;
  auVar163._4_4_ = fVar149 * auVar191._4_4_;
  fVar135 = auVar76._8_4_;
  auVar163._8_4_ = fVar135 * auVar191._8_4_;
  fVar136 = auVar76._12_4_;
  auVar163._12_4_ = fVar136 * auVar191._12_4_;
  auVar156._0_4_ = auVar20._0_4_ * fVar124;
  auVar156._4_4_ = auVar20._4_4_ * fVar149;
  auVar156._8_4_ = auVar20._8_4_ * fVar135;
  auVar156._12_4_ = auVar20._12_4_ * fVar136;
  auVar151._0_4_ = auVar23._0_4_ * fVar124;
  auVar151._4_4_ = auVar23._4_4_ * fVar149;
  auVar151._8_4_ = auVar23._8_4_ * fVar135;
  auVar151._12_4_ = auVar23._12_4_ * fVar136;
  auVar73 = vfmadd231ps_fma(auVar163,auVar75,auVar73);
  auVar191 = vfmadd231ps_fma(auVar156,auVar75,auVar19);
  auVar19 = vfmadd231ps_fma(auVar151,auVar75,auVar22);
  auVar29 = vfmadd231ps_fma(auVar73,auVar184,auVar74);
  auVar126 = vfmadd231ps_fma(auVar191,auVar184,auVar190);
  auVar175._8_4_ = 0x7fffffff;
  auVar175._0_8_ = 0x7fffffff7fffffff;
  auVar175._12_4_ = 0x7fffffff;
  auVar127 = vfmadd231ps_fma(auVar19,auVar184,auVar21);
  auVar74 = vandps_avx(auVar175,auVar28);
  auVar172._8_4_ = 0x219392ef;
  auVar172._0_8_ = 0x219392ef219392ef;
  auVar172._12_4_ = 0x219392ef;
  uVar66 = vcmpps_avx512vl(auVar74,auVar172,1);
  bVar13 = (bool)((byte)uVar66 & 1);
  auVar70._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar28._0_4_;
  bVar13 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar70._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar28._4_4_;
  bVar13 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar70._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar28._8_4_;
  bVar13 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar70._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar28._12_4_;
  auVar74 = vandps_avx(auVar175,auVar27);
  uVar66 = vcmpps_avx512vl(auVar74,auVar172,1);
  bVar13 = (bool)((byte)uVar66 & 1);
  auVar71._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar27._0_4_;
  bVar13 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar71._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar27._4_4_;
  bVar13 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar71._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar27._8_4_;
  bVar13 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar71._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar27._12_4_;
  auVar74 = vandps_avx(auVar175,auVar77);
  uVar66 = vcmpps_avx512vl(auVar74,auVar172,1);
  bVar13 = (bool)((byte)uVar66 & 1);
  auVar72._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar77._0_4_;
  bVar13 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar77._4_4_;
  bVar13 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar77._8_4_;
  bVar13 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar77._12_4_;
  auVar73 = vrcp14ps_avx512vl(auVar70);
  auVar173._8_4_ = 0x3f800000;
  auVar173._0_8_ = 0x3f8000003f800000;
  auVar173._12_4_ = 0x3f800000;
  auVar74 = vfnmadd213ps_fma(auVar70,auVar73,auVar173);
  auVar28 = vfmadd132ps_fma(auVar74,auVar73,auVar73);
  auVar73 = vrcp14ps_avx512vl(auVar71);
  auVar74 = vfnmadd213ps_fma(auVar71,auVar73,auVar173);
  auVar77 = vfmadd132ps_fma(auVar74,auVar73,auVar73);
  auVar73 = vrcp14ps_avx512vl(auVar72);
  auVar74 = vfnmadd213ps_fma(auVar72,auVar73,auVar173);
  auVar26 = vfmadd132ps_fma(auVar74,auVar73,auVar73);
  fVar124 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar25 + 0x16)) *
            *(float *)(prim + lVar25 + 0x1a);
  auVar169._4_4_ = fVar124;
  auVar169._0_4_ = fVar124;
  auVar169._8_4_ = fVar124;
  auVar169._12_4_ = fVar124;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar62 * 7 + 6);
  auVar74 = vpmovsxwd_avx(auVar74);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar62 * 0xb + 6);
  auVar73 = vpmovsxwd_avx(auVar73);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar190 = vsubps_avx(auVar73,auVar74);
  auVar191._8_8_ = 0;
  auVar191._0_8_ = *(ulong *)(prim + uVar62 * 9 + 6);
  auVar73 = vpmovsxwd_avx(auVar191);
  auVar191 = vfmadd213ps_fma(auVar190,auVar169,auVar74);
  auVar74 = vcvtdq2ps_avx(auVar73);
  auVar190._8_8_ = 0;
  auVar190._0_8_ = *(ulong *)(prim + uVar62 * 0xd + 6);
  auVar73 = vpmovsxwd_avx(auVar190);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar74);
  auVar190 = vfmadd213ps_fma(auVar73,auVar169,auVar74);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar62 * 0x12 + 6);
  auVar74 = vpmovsxwd_avx(auVar19);
  auVar74 = vcvtdq2ps_avx(auVar74);
  uVar66 = (ulong)(uint)((int)(uVar62 * 5) << 2);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar62 * 2 + uVar66 + 6);
  auVar73 = vpmovsxwd_avx(auVar20);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar74);
  auVar19 = vfmadd213ps_fma(auVar73,auVar169,auVar74);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar66 + 6);
  auVar74 = vpmovsxwd_avx(auVar21);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar62 * 0x18 + 6);
  auVar73 = vpmovsxwd_avx(auVar22);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar74);
  auVar20 = vfmadd213ps_fma(auVar73,auVar169,auVar74);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar62 * 0x1d + 6);
  auVar74 = vpmovsxwd_avx(auVar23);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar62 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar73 = vpmovsxwd_avx(auVar75);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar74);
  auVar21 = vfmadd213ps_fma(auVar73,auVar169,auVar74);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar62) + 6);
  auVar74 = vpmovsxwd_avx(auVar76);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar62 * 0x23 + 6);
  auVar73 = vpmovsxwd_avx(auVar27);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,auVar74);
  auVar73 = vfmadd213ps_fma(auVar73,auVar169,auVar74);
  auVar74 = vsubps_avx(auVar191,auVar29);
  auVar170._0_4_ = auVar28._0_4_ * auVar74._0_4_;
  auVar170._4_4_ = auVar28._4_4_ * auVar74._4_4_;
  auVar170._8_4_ = auVar28._8_4_ * auVar74._8_4_;
  auVar170._12_4_ = auVar28._12_4_ * auVar74._12_4_;
  auVar74 = vsubps_avx(auVar190,auVar29);
  auVar145._0_4_ = auVar28._0_4_ * auVar74._0_4_;
  auVar145._4_4_ = auVar28._4_4_ * auVar74._4_4_;
  auVar145._8_4_ = auVar28._8_4_ * auVar74._8_4_;
  auVar145._12_4_ = auVar28._12_4_ * auVar74._12_4_;
  auVar74 = vsubps_avx(auVar19,auVar126);
  auVar164._0_4_ = auVar77._0_4_ * auVar74._0_4_;
  auVar164._4_4_ = auVar77._4_4_ * auVar74._4_4_;
  auVar164._8_4_ = auVar77._8_4_ * auVar74._8_4_;
  auVar164._12_4_ = auVar77._12_4_ * auVar74._12_4_;
  auVar74 = vsubps_avx(auVar20,auVar126);
  auVar139._0_4_ = auVar77._0_4_ * auVar74._0_4_;
  auVar139._4_4_ = auVar77._4_4_ * auVar74._4_4_;
  auVar139._8_4_ = auVar77._8_4_ * auVar74._8_4_;
  auVar139._12_4_ = auVar77._12_4_ * auVar74._12_4_;
  auVar74 = vsubps_avx(auVar21,auVar127);
  auVar157._0_4_ = auVar26._0_4_ * auVar74._0_4_;
  auVar157._4_4_ = auVar26._4_4_ * auVar74._4_4_;
  auVar157._8_4_ = auVar26._8_4_ * auVar74._8_4_;
  auVar157._12_4_ = auVar26._12_4_ * auVar74._12_4_;
  auVar74 = vsubps_avx(auVar73,auVar127);
  auVar128._0_4_ = auVar26._0_4_ * auVar74._0_4_;
  auVar128._4_4_ = auVar26._4_4_ * auVar74._4_4_;
  auVar128._8_4_ = auVar26._8_4_ * auVar74._8_4_;
  auVar128._12_4_ = auVar26._12_4_ * auVar74._12_4_;
  auVar74 = vpminsd_avx(auVar170,auVar145);
  auVar73 = vpminsd_avx(auVar164,auVar139);
  auVar74 = vmaxps_avx(auVar74,auVar73);
  auVar73 = vpminsd_avx(auVar157,auVar128);
  uVar125 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar28._4_4_ = uVar125;
  auVar28._0_4_ = uVar125;
  auVar28._8_4_ = uVar125;
  auVar28._12_4_ = uVar125;
  auVar73 = vmaxps_avx512vl(auVar73,auVar28);
  auVar74 = vmaxps_avx(auVar74,auVar73);
  auVar77._8_4_ = 0x3f7ffffa;
  auVar77._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar77._12_4_ = 0x3f7ffffa;
  local_670 = vmulps_avx512vl(auVar74,auVar77);
  auVar74 = vpmaxsd_avx(auVar170,auVar145);
  auVar73 = vpmaxsd_avx(auVar164,auVar139);
  auVar74 = vminps_avx(auVar74,auVar73);
  auVar73 = vpmaxsd_avx(auVar157,auVar128);
  uVar125 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar26._4_4_ = uVar125;
  auVar26._0_4_ = uVar125;
  auVar26._8_4_ = uVar125;
  auVar26._12_4_ = uVar125;
  auVar73 = vminps_avx512vl(auVar73,auVar26);
  auVar74 = vminps_avx(auVar74,auVar73);
  auVar29._8_4_ = 0x3f800003;
  auVar29._0_8_ = 0x3f8000033f800003;
  auVar29._12_4_ = 0x3f800003;
  auVar74 = vmulps_avx512vl(auVar74,auVar29);
  auVar73 = vpbroadcastd_avx512vl();
  uVar137 = vcmpps_avx512vl(local_670,auVar74,2);
  uVar66 = vpcmpgtd_avx512vl(auVar73,_DAT_01f7fcf0);
  uVar66 = ((byte)uVar137 & 0xf) & uVar66;
  if ((char)uVar66 == '\0') {
    bVar67 = 0;
  }
  else {
    local_8a8 = pre->ray_space + k;
    auVar134 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar134);
    do {
      lVar25 = 0;
      for (uVar62 = uVar66; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      uVar7 = *(uint *)(prim + 2);
      pGVar9 = (context->scene->geometries).items[uVar7].ptr;
      local_480._0_8_ = CONCAT44(0,*(uint *)(prim + lVar25 * 4 + 6));
      uVar60 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                               CONCAT44(0,*(uint *)(prim + lVar25 * 4 + 6)) *
                               pGVar9[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar124 = (pGVar9->time_range).lower;
      fVar124 = pGVar9->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x1c0) - fVar124) /
                ((pGVar9->time_range).upper - fVar124));
      auVar74 = vroundss_avx(ZEXT416((uint)fVar124),ZEXT416((uint)fVar124),9);
      auVar74 = vminss_avx(auVar74,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
      auVar74 = vmaxss_avx(ZEXT816(0) << 0x20,auVar74);
      fVar124 = fVar124 - auVar74._0_4_;
      fVar149 = 1.0 - fVar124;
      _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar61 = (long)(int)auVar74._0_4_ * 0x38;
      lVar25 = *(long *)(_Var10 + 0x10 + lVar61);
      lVar65 = *(long *)(_Var10 + 0x38 + lVar61);
      lVar11 = *(long *)(_Var10 + 0x48 + lVar61);
      auVar129._4_4_ = fVar124;
      auVar129._0_4_ = fVar124;
      auVar129._8_4_ = fVar124;
      auVar129._12_4_ = fVar124;
      pfVar3 = (float *)(lVar65 + lVar11 * uVar60);
      auVar176._0_4_ = fVar124 * *pfVar3;
      auVar176._4_4_ = fVar124 * pfVar3[1];
      auVar176._8_4_ = fVar124 * pfVar3[2];
      auVar176._12_4_ = fVar124 * pfVar3[3];
      uVar62 = uVar60 + 1;
      auVar74 = vmulps_avx512vl(auVar129,*(undefined1 (*) [16])(lVar65 + lVar11 * uVar62));
      p_Var12 = pGVar9[4].occlusionFilterN;
      auVar140._4_4_ = fVar149;
      auVar140._0_4_ = fVar149;
      auVar140._8_4_ = fVar149;
      auVar140._12_4_ = fVar149;
      local_8c0 = vfmadd231ps_fma(auVar176,auVar140,
                                  *(undefined1 (*) [16])
                                   (*(long *)(_Var10 + lVar61) + lVar25 * uVar60));
      _local_730 = vfmadd231ps_avx512vl
                             (auVar74,auVar140,
                              *(undefined1 (*) [16])(*(long *)(_Var10 + lVar61) + lVar25 * uVar62));
      pfVar3 = (float *)(*(long *)(p_Var12 + lVar61 + 0x38) +
                        uVar60 * *(long *)(p_Var12 + lVar61 + 0x48));
      auVar177._0_4_ = fVar124 * *pfVar3;
      auVar177._4_4_ = fVar124 * pfVar3[1];
      auVar177._8_4_ = fVar124 * pfVar3[2];
      auVar177._12_4_ = fVar124 * pfVar3[3];
      pfVar3 = (float *)(*(long *)(p_Var12 + lVar61 + 0x38) +
                        *(long *)(p_Var12 + lVar61 + 0x48) * uVar62);
      auVar181._0_4_ = fVar124 * *pfVar3;
      auVar181._4_4_ = fVar124 * pfVar3[1];
      auVar181._8_4_ = fVar124 * pfVar3[2];
      auVar181._12_4_ = fVar124 * pfVar3[3];
      auVar73 = vfmadd231ps_fma(auVar177,auVar140,
                                *(undefined1 (*) [16])
                                 (*(long *)(p_Var12 + lVar61) +
                                 *(long *)(p_Var12 + lVar61 + 0x10) * uVar60));
      auVar191 = vfmadd231ps_fma(auVar181,auVar140,
                                 *(undefined1 (*) [16])
                                  (*(long *)(p_Var12 + lVar61) +
                                  *(long *)(p_Var12 + lVar61 + 0x10) * uVar62));
      iVar8 = (int)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar74 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40))
                              ,0x1c);
      auVar74 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      lVar25 = (long)iVar8 * 0x44;
      auVar141._8_4_ = 0xbeaaaaab;
      auVar141._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar141._12_4_ = 0xbeaaaaab;
      local_8d0 = vfnmadd213ps_fma(auVar73,auVar141,local_8c0);
      local_8e0 = vfmadd213ps_avx512vl(auVar191,auVar141,_local_730);
      auVar191 = vsubps_avx(local_8c0,auVar74);
      uVar125 = auVar191._0_4_;
      auVar146._4_4_ = uVar125;
      auVar146._0_4_ = uVar125;
      auVar146._8_4_ = uVar125;
      auVar146._12_4_ = uVar125;
      auVar73 = vshufps_avx(auVar191,auVar191,0x55);
      aVar4 = (local_8a8->vx).field_0;
      aVar5 = (local_8a8->vy).field_0;
      fVar124 = (local_8a8->vz).field_0.m128[0];
      fVar149 = *(float *)((long)&(local_8a8->vz).field_0 + 4);
      fVar135 = *(float *)((long)&(local_8a8->vz).field_0 + 8);
      fVar136 = *(float *)((long)&(local_8a8->vz).field_0 + 0xc);
      auVar191 = vshufps_avx(auVar191,auVar191,0xaa);
      auVar179._0_4_ = fVar124 * auVar191._0_4_;
      auVar179._4_4_ = fVar149 * auVar191._4_4_;
      auVar179._8_4_ = fVar135 * auVar191._8_4_;
      auVar179._12_4_ = fVar136 * auVar191._12_4_;
      auVar73 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar5,auVar73);
      auVar190 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar4,auVar146);
      auVar191 = vsubps_avx(local_8d0,auVar74);
      uVar125 = auVar191._0_4_;
      auVar147._4_4_ = uVar125;
      auVar147._0_4_ = uVar125;
      auVar147._8_4_ = uVar125;
      auVar147._12_4_ = uVar125;
      auVar73 = vshufps_avx(auVar191,auVar191,0x55);
      auVar191 = vshufps_avx(auVar191,auVar191,0xaa);
      auVar182._0_4_ = fVar124 * auVar191._0_4_;
      auVar182._4_4_ = fVar149 * auVar191._4_4_;
      auVar182._8_4_ = fVar135 * auVar191._8_4_;
      auVar182._12_4_ = fVar136 * auVar191._12_4_;
      auVar73 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar5,auVar73);
      auVar19 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar4,auVar147);
      auVar191 = vsubps_avx(local_8e0,auVar74);
      uVar125 = auVar191._0_4_;
      auVar148._4_4_ = uVar125;
      auVar148._0_4_ = uVar125;
      auVar148._8_4_ = uVar125;
      auVar148._12_4_ = uVar125;
      auVar73 = vshufps_avx(auVar191,auVar191,0x55);
      auVar191 = vshufps_avx(auVar191,auVar191,0xaa);
      auVar183._0_4_ = fVar124 * auVar191._0_4_;
      auVar183._4_4_ = fVar149 * auVar191._4_4_;
      auVar183._8_4_ = fVar135 * auVar191._8_4_;
      auVar183._12_4_ = fVar136 * auVar191._12_4_;
      auVar73 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar5,auVar73);
      auVar191 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar4,auVar148);
      auVar73 = vsubps_avx512vl(_local_730,auVar74);
      uVar125 = auVar73._0_4_;
      auVar142._4_4_ = uVar125;
      auVar142._0_4_ = uVar125;
      auVar142._8_4_ = uVar125;
      auVar142._12_4_ = uVar125;
      auVar74 = vshufps_avx(auVar73,auVar73,0x55);
      auVar73 = vshufps_avx(auVar73,auVar73,0xaa);
      auVar186._0_4_ = fVar124 * auVar73._0_4_;
      auVar186._4_4_ = fVar149 * auVar73._4_4_;
      auVar186._8_4_ = fVar135 * auVar73._8_4_;
      auVar186._12_4_ = fVar136 * auVar73._12_4_;
      auVar74 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar5,auVar74);
      auVar20 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar4,auVar142);
      auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar25);
      uVar125 = auVar190._0_4_;
      local_7c0._4_4_ = uVar125;
      local_7c0._0_4_ = uVar125;
      local_7c0._8_4_ = uVar125;
      local_7c0._12_4_ = uVar125;
      local_7c0._16_4_ = uVar125;
      local_7c0._20_4_ = uVar125;
      local_7c0._24_4_ = uVar125;
      local_7c0._28_4_ = uVar125;
      auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x484);
      auVar78._8_4_ = 1;
      auVar78._0_8_ = 0x100000001;
      auVar78._12_4_ = 1;
      auVar78._16_4_ = 1;
      auVar78._20_4_ = 1;
      auVar78._24_4_ = 1;
      auVar78._28_4_ = 1;
      local_760 = vpermps_avx2(auVar78,ZEXT1632(auVar190));
      uVar125 = auVar19._0_4_;
      local_7e0._4_4_ = uVar125;
      local_7e0._0_4_ = uVar125;
      local_7e0._8_4_ = uVar125;
      local_7e0._12_4_ = uVar125;
      local_7e0._16_4_ = uVar125;
      local_7e0._20_4_ = uVar125;
      local_7e0._24_4_ = uVar125;
      local_7e0._28_4_ = uVar125;
      local_800 = vpermps_avx512vl(auVar78,ZEXT1632(auVar19));
      auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x908);
      local_820 = vbroadcastss_avx512vl(auVar191);
      local_840 = vpermps_avx512vl(auVar78,ZEXT1632(auVar191));
      auVar90 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0xd8c);
      uVar125 = auVar20._0_4_;
      local_880._4_4_ = uVar125;
      local_880._0_4_ = uVar125;
      local_880._8_4_ = uVar125;
      local_880._12_4_ = uVar125;
      local_880._16_4_ = uVar125;
      local_880._20_4_ = uVar125;
      local_880._24_4_ = uVar125;
      local_880._28_4_ = uVar125;
      local_780 = vpermps_avx512vl(auVar78,ZEXT1632(auVar20));
      auVar78 = vmulps_avx512vl(local_880,auVar90);
      auVar79 = vmulps_avx512vl(local_780,auVar90);
      auVar78 = vfmadd231ps_avx512vl(auVar78,auVar91,local_820);
      auVar79 = vfmadd231ps_avx512vl(auVar79,auVar91,local_840);
      auVar78 = vfmadd231ps_avx512vl(auVar78,auVar93,local_7e0);
      auVar80 = vfmadd231ps_avx512vl(auVar79,auVar93,local_800);
      auVar81 = vfmadd231ps_avx512vl(auVar78,auVar92,local_7c0);
      auVar78 = *(undefined1 (*) [32])(bezier_basis1 + lVar25);
      auVar79 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x484);
      auVar89 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x908);
      auVar82 = vfmadd231ps_avx512vl(auVar80,auVar92,local_760);
      auVar80 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0xd8c);
      auVar83 = vmulps_avx512vl(local_880,auVar80);
      auVar84 = vmulps_avx512vl(local_780,auVar80);
      auVar83 = vfmadd231ps_avx512vl(auVar83,auVar89,local_820);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar89,local_840);
      auVar83 = vfmadd231ps_avx512vl(auVar83,auVar79,local_7e0);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar79,local_800);
      auVar21 = vfmadd231ps_fma(auVar83,auVar78,local_7c0);
      auVar22 = vfmadd231ps_fma(auVar84,auVar78,local_760);
      auVar84 = vsubps_avx512vl(ZEXT1632(auVar21),auVar81);
      auVar85 = vsubps_avx512vl(ZEXT1632(auVar22),auVar82);
      auVar83 = vmulps_avx512vl(auVar82,auVar84);
      auVar86 = vmulps_avx512vl(auVar81,auVar85);
      auVar83 = vsubps_avx512vl(auVar83,auVar86);
      auVar74 = vshufps_avx(local_8c0,local_8c0,0xff);
      uVar137 = auVar74._0_8_;
      local_320._8_8_ = uVar137;
      local_320._0_8_ = uVar137;
      local_320._16_8_ = uVar137;
      local_320._24_8_ = uVar137;
      auVar74 = vshufps_avx(local_8d0,local_8d0,0xff);
      local_340 = vbroadcastsd_avx512vl(auVar74);
      auVar74 = vshufps_avx(local_8e0,local_8e0,0xff);
      local_360 = vbroadcastsd_avx512vl(auVar74);
      auVar74 = vshufps_avx512vl(_local_730,_local_730,0xff);
      uVar137 = auVar74._0_8_;
      register0x000012c8 = uVar137;
      local_380 = uVar137;
      register0x000012d0 = uVar137;
      register0x000012d8 = uVar137;
      auVar86 = vmulps_avx512vl(_local_380,auVar90);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar91,local_360);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar93,local_340);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar92,local_320);
      auVar87 = vmulps_avx512vl(_local_380,auVar80);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar89,local_360);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar79,local_340);
      auVar23 = vfmadd231ps_fma(auVar87,auVar78,local_320);
      auVar87 = vmulps_avx512vl(auVar85,auVar85);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar84,auVar84);
      auVar88 = vmaxps_avx512vl(auVar86,ZEXT1632(auVar23));
      auVar88 = vmulps_avx512vl(auVar88,auVar88);
      auVar87 = vmulps_avx512vl(auVar88,auVar87);
      auVar83 = vmulps_avx512vl(auVar83,auVar83);
      uVar137 = vcmpps_avx512vl(auVar83,auVar87,2);
      auVar74 = vblendps_avx(auVar190,local_8c0,8);
      auVar75 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar73 = vandps_avx512vl(auVar74,auVar75);
      auVar74 = vblendps_avx(auVar19,local_8d0,8);
      auVar74 = vandps_avx512vl(auVar74,auVar75);
      auVar73 = vmaxps_avx(auVar73,auVar74);
      auVar74 = vblendps_avx(auVar191,local_8e0,8);
      auVar76 = vandps_avx512vl(auVar74,auVar75);
      auVar74 = vblendps_avx(auVar20,_local_730,8);
      auVar74 = vandps_avx512vl(auVar74,auVar75);
      auVar74 = vmaxps_avx(auVar76,auVar74);
      auVar74 = vmaxps_avx(auVar73,auVar74);
      auVar73 = vmovshdup_avx(auVar74);
      auVar73 = vmaxss_avx(auVar73,auVar74);
      auVar74 = vshufpd_avx(auVar74,auVar74,1);
      auVar74 = vmaxss_avx(auVar74,auVar73);
      auVar73 = vcvtsi2ss_avx512f(_local_730,iVar8);
      local_4c0._0_16_ = auVar73;
      auVar87._0_4_ = auVar73._0_4_;
      auVar87._4_4_ = auVar87._0_4_;
      auVar87._8_4_ = auVar87._0_4_;
      auVar87._12_4_ = auVar87._0_4_;
      auVar87._16_4_ = auVar87._0_4_;
      auVar87._20_4_ = auVar87._0_4_;
      auVar87._24_4_ = auVar87._0_4_;
      auVar87._28_4_ = auVar87._0_4_;
      uVar24 = vcmpps_avx512vl(auVar87,_DAT_01faff40,0xe);
      bVar67 = (byte)uVar137 & (byte)uVar24;
      fVar124 = auVar74._0_4_ * 4.7683716e-07;
      auVar83._8_4_ = 2;
      auVar83._0_8_ = 0x200000002;
      auVar83._12_4_ = 2;
      auVar83._16_4_ = 2;
      auVar83._20_4_ = 2;
      auVar83._24_4_ = 2;
      auVar83._28_4_ = 2;
      local_3a0 = vpermps_avx512vl(auVar83,ZEXT1632(auVar190));
      local_3c0 = vpermps_avx512vl(auVar83,ZEXT1632(auVar19));
      local_3e0 = vpermps_avx512vl(auVar83,ZEXT1632(auVar191));
      auVar83 = vpermps_avx2(auVar83,ZEXT1632(auVar20));
      uVar64 = *(uint *)(ray + k * 4 + 0xc0);
      auVar73 = local_3a0._0_16_;
      auVar74 = ZEXT416((uint)fVar124);
      if (bVar67 == 0) {
        uVar62 = 0;
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar134 = ZEXT3264(auVar92);
        auVar74 = vxorps_avx512vl(auVar73,auVar73);
        auVar192 = ZEXT1664(auVar74);
        auVar193 = ZEXT3264(local_7c0);
        auVar194 = ZEXT3264(local_760);
        auVar195 = ZEXT3264(local_7e0);
        auVar196 = ZEXT3264(local_800);
        auVar197 = ZEXT3264(local_820);
        auVar198 = ZEXT3264(local_840);
        auVar200 = ZEXT3264(local_880);
        auVar199 = ZEXT3264(local_780);
      }
      else {
        local_8a0._0_16_ = ZEXT416(uVar64);
        auVar80 = vmulps_avx512vl(auVar83,auVar80);
        auVar89 = vfmadd213ps_avx512vl(auVar89,local_3e0,auVar80);
        auVar79 = vfmadd213ps_avx512vl(auVar79,local_3c0,auVar89);
        auVar80 = vfmadd213ps_avx512vl(auVar78,local_3a0,auVar79);
        auVar90 = vmulps_avx512vl(auVar83,auVar90);
        auVar91 = vfmadd213ps_avx512vl(auVar91,local_3e0,auVar90);
        auVar79 = vfmadd213ps_avx512vl(auVar93,local_3c0,auVar91);
        auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1210);
        auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1694);
        auVar90 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1b18);
        auVar78 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1f9c);
        auVar88 = vfmadd213ps_avx512vl(auVar92,local_3a0,auVar79);
        auVar92 = vmulps_avx512vl(local_880,auVar78);
        auVar79 = vmulps_avx512vl(local_780,auVar78);
        auVar78 = vmulps_avx512vl(auVar83,auVar78);
        auVar191 = vfmadd231ps_fma(auVar92,auVar90,local_820);
        auVar198 = ZEXT3264(local_840);
        auVar92 = vfmadd231ps_avx512vl(auVar79,auVar90,local_840);
        auVar90 = vfmadd231ps_avx512vl(auVar78,local_3e0,auVar90);
        auVar78 = vfmadd231ps_avx512vl(ZEXT1632(auVar191),auVar91,local_7e0);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar91,local_800);
        auVar79 = vfmadd231ps_avx512vl(auVar90,local_3c0,auVar91);
        auVar78 = vfmadd231ps_avx512vl(auVar78,auVar93,local_7c0);
        auVar89 = vfmadd231ps_avx512vl(auVar92,auVar93,local_760);
        auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1210);
        auVar91 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1b18);
        auVar90 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1f9c);
        auVar79 = vfmadd231ps_avx512vl(auVar79,local_3a0,auVar93);
        auVar93 = vmulps_avx512vl(local_880,auVar90);
        auVar94 = vmulps_avx512vl(local_780,auVar90);
        auVar90 = vmulps_avx512vl(auVar83,auVar90);
        auVar191 = vfmadd231ps_fma(auVar93,auVar91,local_820);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar91,local_840);
        auVar91 = vfmadd231ps_avx512vl(auVar90,local_3e0,auVar91);
        auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1694);
        auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar191),auVar93,local_7e0);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar93,local_800);
        auVar93 = vfmadd231ps_avx512vl(auVar91,local_3c0,auVar93);
        auVar91 = vfmadd231ps_avx512vl(auVar90,auVar92,local_7c0);
        auVar90 = vfmadd231ps_avx512vl(auVar94,auVar92,local_760);
        auVar94 = vfmadd231ps_avx512vl(auVar93,local_3a0,auVar92);
        auVar187._8_4_ = 0x7fffffff;
        auVar187._0_8_ = 0x7fffffff7fffffff;
        auVar187._12_4_ = 0x7fffffff;
        auVar187._16_4_ = 0x7fffffff;
        auVar187._20_4_ = 0x7fffffff;
        auVar187._24_4_ = 0x7fffffff;
        auVar187._28_4_ = 0x7fffffff;
        auVar92 = vandps_avx(auVar78,auVar187);
        auVar93 = vandps_avx(auVar89,auVar187);
        auVar93 = vmaxps_avx(auVar92,auVar93);
        auVar92 = vandps_avx(auVar79,auVar187);
        auVar92 = vmaxps_avx(auVar93,auVar92);
        auVar79 = vbroadcastss_avx512vl(auVar74);
        uVar60 = vcmpps_avx512vl(auVar92,auVar79,1);
        bVar13 = (bool)((byte)uVar60 & 1);
        auVar95._0_4_ = (float)((uint)bVar13 * auVar84._0_4_ | (uint)!bVar13 * auVar78._0_4_);
        bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar95._4_4_ = (float)((uint)bVar13 * auVar84._4_4_ | (uint)!bVar13 * auVar78._4_4_);
        bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar95._8_4_ = (float)((uint)bVar13 * auVar84._8_4_ | (uint)!bVar13 * auVar78._8_4_);
        bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar95._12_4_ = (float)((uint)bVar13 * auVar84._12_4_ | (uint)!bVar13 * auVar78._12_4_);
        bVar13 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar95._16_4_ = (float)((uint)bVar13 * auVar84._16_4_ | (uint)!bVar13 * auVar78._16_4_);
        bVar13 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar95._20_4_ = (float)((uint)bVar13 * auVar84._20_4_ | (uint)!bVar13 * auVar78._20_4_);
        bVar13 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar95._24_4_ = (float)((uint)bVar13 * auVar84._24_4_ | (uint)!bVar13 * auVar78._24_4_);
        bVar13 = SUB81(uVar60 >> 7,0);
        auVar95._28_4_ = (uint)bVar13 * auVar84._28_4_ | (uint)!bVar13 * auVar78._28_4_;
        bVar13 = (bool)((byte)uVar60 & 1);
        auVar96._0_4_ = (float)((uint)bVar13 * auVar85._0_4_ | (uint)!bVar13 * auVar89._0_4_);
        bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar96._4_4_ = (float)((uint)bVar13 * auVar85._4_4_ | (uint)!bVar13 * auVar89._4_4_);
        bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar96._8_4_ = (float)((uint)bVar13 * auVar85._8_4_ | (uint)!bVar13 * auVar89._8_4_);
        bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar96._12_4_ = (float)((uint)bVar13 * auVar85._12_4_ | (uint)!bVar13 * auVar89._12_4_);
        bVar13 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar96._16_4_ = (float)((uint)bVar13 * auVar85._16_4_ | (uint)!bVar13 * auVar89._16_4_);
        bVar13 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar96._20_4_ = (float)((uint)bVar13 * auVar85._20_4_ | (uint)!bVar13 * auVar89._20_4_);
        bVar13 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar96._24_4_ = (float)((uint)bVar13 * auVar85._24_4_ | (uint)!bVar13 * auVar89._24_4_);
        bVar13 = SUB81(uVar60 >> 7,0);
        auVar96._28_4_ = (uint)bVar13 * auVar85._28_4_ | (uint)!bVar13 * auVar89._28_4_;
        auVar92 = vandps_avx(auVar187,auVar91);
        auVar93 = vandps_avx(auVar90,auVar187);
        auVar93 = vmaxps_avx(auVar92,auVar93);
        auVar92 = vandps_avx(auVar94,auVar187);
        auVar92 = vmaxps_avx(auVar93,auVar92);
        uVar60 = vcmpps_avx512vl(auVar92,auVar79,1);
        bVar13 = (bool)((byte)uVar60 & 1);
        auVar97._0_4_ = (float)((uint)bVar13 * auVar84._0_4_ | (uint)!bVar13 * auVar91._0_4_);
        bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar97._4_4_ = (float)((uint)bVar13 * auVar84._4_4_ | (uint)!bVar13 * auVar91._4_4_);
        bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar97._8_4_ = (float)((uint)bVar13 * auVar84._8_4_ | (uint)!bVar13 * auVar91._8_4_);
        bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar97._12_4_ = (float)((uint)bVar13 * auVar84._12_4_ | (uint)!bVar13 * auVar91._12_4_);
        bVar13 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar97._16_4_ = (float)((uint)bVar13 * auVar84._16_4_ | (uint)!bVar13 * auVar91._16_4_);
        bVar13 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar97._20_4_ = (float)((uint)bVar13 * auVar84._20_4_ | (uint)!bVar13 * auVar91._20_4_);
        bVar13 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar97._24_4_ = (float)((uint)bVar13 * auVar84._24_4_ | (uint)!bVar13 * auVar91._24_4_);
        bVar13 = SUB81(uVar60 >> 7,0);
        auVar97._28_4_ = (uint)bVar13 * auVar84._28_4_ | (uint)!bVar13 * auVar91._28_4_;
        bVar13 = (bool)((byte)uVar60 & 1);
        auVar98._0_4_ = (float)((uint)bVar13 * auVar85._0_4_ | (uint)!bVar13 * auVar90._0_4_);
        bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar98._4_4_ = (float)((uint)bVar13 * auVar85._4_4_ | (uint)!bVar13 * auVar90._4_4_);
        bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar98._8_4_ = (float)((uint)bVar13 * auVar85._8_4_ | (uint)!bVar13 * auVar90._8_4_);
        bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar98._12_4_ = (float)((uint)bVar13 * auVar85._12_4_ | (uint)!bVar13 * auVar90._12_4_);
        bVar13 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar98._16_4_ = (float)((uint)bVar13 * auVar85._16_4_ | (uint)!bVar13 * auVar90._16_4_);
        bVar13 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar98._20_4_ = (float)((uint)bVar13 * auVar85._20_4_ | (uint)!bVar13 * auVar90._20_4_);
        bVar13 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar98._24_4_ = (float)((uint)bVar13 * auVar85._24_4_ | (uint)!bVar13 * auVar90._24_4_);
        bVar13 = SUB81(uVar60 >> 7,0);
        auVar98._28_4_ = (uint)bVar13 * auVar85._28_4_ | (uint)!bVar13 * auVar90._28_4_;
        auVar77 = vxorps_avx512vl(auVar73,auVar73);
        auVar192 = ZEXT1664(auVar77);
        auVar92 = vfmadd213ps_avx512vl(auVar95,auVar95,ZEXT1632(auVar77));
        auVar73 = vfmadd231ps_fma(auVar92,auVar96,auVar96);
        auVar93 = vrsqrt14ps_avx512vl(ZEXT1632(auVar73));
        fVar149 = auVar93._0_4_;
        fVar135 = auVar93._4_4_;
        fVar136 = auVar93._8_4_;
        fVar168 = auVar93._12_4_;
        fVar167 = auVar93._16_4_;
        fVar171 = auVar93._20_4_;
        fVar68 = auVar93._24_4_;
        auVar92._4_4_ = fVar135 * fVar135 * fVar135 * auVar73._4_4_ * -0.5;
        auVar92._0_4_ = fVar149 * fVar149 * fVar149 * auVar73._0_4_ * -0.5;
        auVar92._8_4_ = fVar136 * fVar136 * fVar136 * auVar73._8_4_ * -0.5;
        auVar92._12_4_ = fVar168 * fVar168 * fVar168 * auVar73._12_4_ * -0.5;
        auVar92._16_4_ = fVar167 * fVar167 * fVar167 * -0.0;
        auVar92._20_4_ = fVar171 * fVar171 * fVar171 * -0.0;
        auVar92._24_4_ = fVar68 * fVar68 * fVar68 * -0.0;
        auVar92._28_4_ = auVar94._28_4_;
        auVar78 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar78,auVar93);
        auVar93._4_4_ = auVar96._4_4_ * auVar92._4_4_;
        auVar93._0_4_ = auVar96._0_4_ * auVar92._0_4_;
        auVar93._8_4_ = auVar96._8_4_ * auVar92._8_4_;
        auVar93._12_4_ = auVar96._12_4_ * auVar92._12_4_;
        auVar93._16_4_ = auVar96._16_4_ * auVar92._16_4_;
        auVar93._20_4_ = auVar96._20_4_ * auVar92._20_4_;
        auVar93._24_4_ = auVar96._24_4_ * auVar92._24_4_;
        auVar93._28_4_ = 0;
        auVar91._4_4_ = auVar92._4_4_ * -auVar95._4_4_;
        auVar91._0_4_ = auVar92._0_4_ * -auVar95._0_4_;
        auVar91._8_4_ = auVar92._8_4_ * -auVar95._8_4_;
        auVar91._12_4_ = auVar92._12_4_ * -auVar95._12_4_;
        auVar91._16_4_ = auVar92._16_4_ * -auVar95._16_4_;
        auVar91._20_4_ = auVar92._20_4_ * -auVar95._20_4_;
        auVar91._24_4_ = auVar92._24_4_ * -auVar95._24_4_;
        auVar91._28_4_ = auVar96._28_4_;
        auVar92 = vmulps_avx512vl(auVar92,ZEXT1632(auVar77));
        auVar85 = ZEXT1632(auVar77);
        auVar90 = vfmadd213ps_avx512vl(auVar97,auVar97,auVar85);
        auVar73 = vfmadd231ps_fma(auVar90,auVar98,auVar98);
        auVar89 = vrsqrt14ps_avx512vl(ZEXT1632(auVar73));
        fVar149 = auVar89._0_4_;
        fVar135 = auVar89._4_4_;
        fVar136 = auVar89._8_4_;
        fVar168 = auVar89._12_4_;
        fVar167 = auVar89._16_4_;
        fVar171 = auVar89._20_4_;
        fVar68 = auVar89._24_4_;
        auVar90._4_4_ = fVar135 * fVar135 * fVar135 * auVar73._4_4_ * -0.5;
        auVar90._0_4_ = fVar149 * fVar149 * fVar149 * auVar73._0_4_ * -0.5;
        auVar90._8_4_ = fVar136 * fVar136 * fVar136 * auVar73._8_4_ * -0.5;
        auVar90._12_4_ = fVar168 * fVar168 * fVar168 * auVar73._12_4_ * -0.5;
        auVar90._16_4_ = fVar167 * fVar167 * fVar167 * -0.0;
        auVar90._20_4_ = fVar171 * fVar171 * fVar171 * -0.0;
        auVar90._24_4_ = fVar68 * fVar68 * fVar68 * -0.0;
        auVar90._28_4_ = 0;
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar78,auVar89);
        auVar79._4_4_ = auVar98._4_4_ * auVar90._4_4_;
        auVar79._0_4_ = auVar98._0_4_ * auVar90._0_4_;
        auVar79._8_4_ = auVar98._8_4_ * auVar90._8_4_;
        auVar79._12_4_ = auVar98._12_4_ * auVar90._12_4_;
        auVar79._16_4_ = auVar98._16_4_ * auVar90._16_4_;
        auVar79._20_4_ = auVar98._20_4_ * auVar90._20_4_;
        auVar79._24_4_ = auVar98._24_4_ * auVar90._24_4_;
        auVar79._28_4_ = auVar89._28_4_;
        auVar89._4_4_ = -auVar97._4_4_ * auVar90._4_4_;
        auVar89._0_4_ = -auVar97._0_4_ * auVar90._0_4_;
        auVar89._8_4_ = -auVar97._8_4_ * auVar90._8_4_;
        auVar89._12_4_ = -auVar97._12_4_ * auVar90._12_4_;
        auVar89._16_4_ = -auVar97._16_4_ * auVar90._16_4_;
        auVar89._20_4_ = -auVar97._20_4_ * auVar90._20_4_;
        auVar89._24_4_ = -auVar97._24_4_ * auVar90._24_4_;
        auVar89._28_4_ = auVar97._28_4_ ^ 0x80000000;
        auVar90 = vmulps_avx512vl(auVar90,auVar85);
        auVar73 = vfmadd213ps_fma(auVar93,auVar86,auVar81);
        auVar191 = vfmadd213ps_fma(auVar91,auVar86,auVar82);
        auVar78 = vfmadd213ps_avx512vl(auVar92,auVar86,auVar88);
        auVar84 = vfmadd213ps_avx512vl(auVar79,ZEXT1632(auVar23),ZEXT1632(auVar21));
        auVar75 = vfnmadd213ps_fma(auVar93,auVar86,auVar81);
        auVar81 = ZEXT1632(auVar23);
        auVar190 = vfmadd213ps_fma(auVar89,auVar81,ZEXT1632(auVar22));
        auVar76 = vfnmadd213ps_fma(auVar91,auVar86,auVar82);
        auVar19 = vfmadd213ps_fma(auVar90,auVar81,auVar80);
        auVar93 = vfnmadd231ps_avx512vl(auVar88,auVar86,auVar92);
        auVar27 = vfnmadd213ps_fma(auVar79,auVar81,ZEXT1632(auVar21));
        auVar22 = vfnmadd213ps_fma(auVar89,auVar81,ZEXT1632(auVar22));
        auVar28 = vfnmadd231ps_fma(auVar80,ZEXT1632(auVar23),auVar90);
        auVar91 = vsubps_avx512vl(auVar84,ZEXT1632(auVar75));
        auVar92 = vsubps_avx(ZEXT1632(auVar190),ZEXT1632(auVar76));
        auVar90 = vsubps_avx512vl(ZEXT1632(auVar19),auVar93);
        auVar79 = vmulps_avx512vl(auVar92,auVar93);
        auVar20 = vfmsub231ps_fma(auVar79,ZEXT1632(auVar76),auVar90);
        auVar80._4_4_ = auVar75._4_4_ * auVar90._4_4_;
        auVar80._0_4_ = auVar75._0_4_ * auVar90._0_4_;
        auVar80._8_4_ = auVar75._8_4_ * auVar90._8_4_;
        auVar80._12_4_ = auVar75._12_4_ * auVar90._12_4_;
        auVar80._16_4_ = auVar90._16_4_ * 0.0;
        auVar80._20_4_ = auVar90._20_4_ * 0.0;
        auVar80._24_4_ = auVar90._24_4_ * 0.0;
        auVar80._28_4_ = auVar90._28_4_;
        auVar90 = vfmsub231ps_avx512vl(auVar80,auVar93,auVar91);
        auVar81._4_4_ = auVar76._4_4_ * auVar91._4_4_;
        auVar81._0_4_ = auVar76._0_4_ * auVar91._0_4_;
        auVar81._8_4_ = auVar76._8_4_ * auVar91._8_4_;
        auVar81._12_4_ = auVar76._12_4_ * auVar91._12_4_;
        auVar81._16_4_ = auVar91._16_4_ * 0.0;
        auVar81._20_4_ = auVar91._20_4_ * 0.0;
        auVar81._24_4_ = auVar91._24_4_ * 0.0;
        auVar81._28_4_ = auVar91._28_4_;
        auVar21 = vfmsub231ps_fma(auVar81,ZEXT1632(auVar75),auVar92);
        auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar21),auVar85,auVar90);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar85,ZEXT1632(auVar20));
        auVar95 = ZEXT1632(auVar77);
        uVar60 = vcmpps_avx512vl(auVar92,auVar95,2);
        bVar59 = (byte)uVar60;
        fVar68 = (float)((uint)(bVar59 & 1) * auVar73._0_4_ |
                        (uint)!(bool)(bVar59 & 1) * auVar27._0_4_);
        bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
        fVar116 = (float)((uint)bVar13 * auVar73._4_4_ | (uint)!bVar13 * auVar27._4_4_);
        bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
        fVar118 = (float)((uint)bVar13 * auVar73._8_4_ | (uint)!bVar13 * auVar27._8_4_);
        bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
        fVar120 = (float)((uint)bVar13 * auVar73._12_4_ | (uint)!bVar13 * auVar27._12_4_);
        auVar89 = ZEXT1632(CONCAT412(fVar120,CONCAT48(fVar118,CONCAT44(fVar116,fVar68))));
        fVar69 = (float)((uint)(bVar59 & 1) * auVar191._0_4_ |
                        (uint)!(bool)(bVar59 & 1) * auVar22._0_4_);
        bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
        fVar117 = (float)((uint)bVar13 * auVar191._4_4_ | (uint)!bVar13 * auVar22._4_4_);
        bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
        fVar119 = (float)((uint)bVar13 * auVar191._8_4_ | (uint)!bVar13 * auVar22._8_4_);
        bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
        fVar121 = (float)((uint)bVar13 * auVar191._12_4_ | (uint)!bVar13 * auVar22._12_4_);
        auVar80 = ZEXT1632(CONCAT412(fVar121,CONCAT48(fVar119,CONCAT44(fVar117,fVar69))));
        auVar88._0_4_ =
             (float)((uint)(bVar59 & 1) * auVar78._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar28._0_4_)
        ;
        bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar88._4_4_ = (float)((uint)bVar13 * auVar78._4_4_ | (uint)!bVar13 * auVar28._4_4_);
        bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar88._8_4_ = (float)((uint)bVar13 * auVar78._8_4_ | (uint)!bVar13 * auVar28._8_4_);
        bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar88._12_4_ = (float)((uint)bVar13 * auVar78._12_4_ | (uint)!bVar13 * auVar28._12_4_);
        fVar149 = (float)((uint)((byte)(uVar60 >> 4) & 1) * auVar78._16_4_);
        auVar88._16_4_ = fVar149;
        fVar135 = (float)((uint)((byte)(uVar60 >> 5) & 1) * auVar78._20_4_);
        auVar88._20_4_ = fVar135;
        fVar136 = (float)((uint)((byte)(uVar60 >> 6) & 1) * auVar78._24_4_);
        auVar88._24_4_ = fVar136;
        iVar1 = (uint)(byte)(uVar60 >> 7) * auVar78._28_4_;
        auVar88._28_4_ = iVar1;
        auVar91 = vblendmps_avx512vl(ZEXT1632(auVar75),auVar84);
        auVar94._0_4_ =
             (uint)(bVar59 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar20._0_4_;
        bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar94._4_4_ = (uint)bVar13 * auVar91._4_4_ | (uint)!bVar13 * auVar20._4_4_;
        bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar94._8_4_ = (uint)bVar13 * auVar91._8_4_ | (uint)!bVar13 * auVar20._8_4_;
        bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar94._12_4_ = (uint)bVar13 * auVar91._12_4_ | (uint)!bVar13 * auVar20._12_4_;
        auVar94._16_4_ = (uint)((byte)(uVar60 >> 4) & 1) * auVar91._16_4_;
        auVar94._20_4_ = (uint)((byte)(uVar60 >> 5) & 1) * auVar91._20_4_;
        auVar94._24_4_ = (uint)((byte)(uVar60 >> 6) & 1) * auVar91._24_4_;
        auVar94._28_4_ = (uint)(byte)(uVar60 >> 7) * auVar91._28_4_;
        auVar91 = vblendmps_avx512vl(ZEXT1632(auVar76),ZEXT1632(auVar190));
        auVar99._0_4_ =
             (float)((uint)(bVar59 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar191._0_4_
                    );
        bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar99._4_4_ = (float)((uint)bVar13 * auVar91._4_4_ | (uint)!bVar13 * auVar191._4_4_);
        bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar99._8_4_ = (float)((uint)bVar13 * auVar91._8_4_ | (uint)!bVar13 * auVar191._8_4_);
        bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar99._12_4_ = (float)((uint)bVar13 * auVar91._12_4_ | (uint)!bVar13 * auVar191._12_4_);
        fVar171 = (float)((uint)((byte)(uVar60 >> 4) & 1) * auVar91._16_4_);
        auVar99._16_4_ = fVar171;
        fVar167 = (float)((uint)((byte)(uVar60 >> 5) & 1) * auVar91._20_4_);
        auVar99._20_4_ = fVar167;
        fVar168 = (float)((uint)((byte)(uVar60 >> 6) & 1) * auVar91._24_4_);
        auVar99._24_4_ = fVar168;
        auVar99._28_4_ = (uint)(byte)(uVar60 >> 7) * auVar91._28_4_;
        auVar91 = vblendmps_avx512vl(auVar93,ZEXT1632(auVar19));
        auVar100._0_4_ =
             (float)((uint)(bVar59 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar78._0_4_)
        ;
        bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar100._4_4_ = (float)((uint)bVar13 * auVar91._4_4_ | (uint)!bVar13 * auVar78._4_4_);
        bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar100._8_4_ = (float)((uint)bVar13 * auVar91._8_4_ | (uint)!bVar13 * auVar78._8_4_);
        bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar100._12_4_ = (float)((uint)bVar13 * auVar91._12_4_ | (uint)!bVar13 * auVar78._12_4_);
        bVar13 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar100._16_4_ = (float)((uint)bVar13 * auVar91._16_4_ | (uint)!bVar13 * auVar78._16_4_);
        bVar13 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar100._20_4_ = (float)((uint)bVar13 * auVar91._20_4_ | (uint)!bVar13 * auVar78._20_4_);
        bVar13 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar100._24_4_ = (float)((uint)bVar13 * auVar91._24_4_ | (uint)!bVar13 * auVar78._24_4_);
        bVar13 = SUB81(uVar60 >> 7,0);
        auVar100._28_4_ = (uint)bVar13 * auVar91._28_4_ | (uint)!bVar13 * auVar78._28_4_;
        auVar101._0_4_ =
             (uint)(bVar59 & 1) * (int)auVar75._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar84._0_4_;
        bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar101._4_4_ = (uint)bVar13 * (int)auVar75._4_4_ | (uint)!bVar13 * auVar84._4_4_;
        bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar101._8_4_ = (uint)bVar13 * (int)auVar75._8_4_ | (uint)!bVar13 * auVar84._8_4_;
        bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar101._12_4_ = (uint)bVar13 * (int)auVar75._12_4_ | (uint)!bVar13 * auVar84._12_4_;
        auVar101._16_4_ = (uint)!(bool)((byte)(uVar60 >> 4) & 1) * auVar84._16_4_;
        auVar101._20_4_ = (uint)!(bool)((byte)(uVar60 >> 5) & 1) * auVar84._20_4_;
        auVar101._24_4_ = (uint)!(bool)((byte)(uVar60 >> 6) & 1) * auVar84._24_4_;
        auVar101._28_4_ = (uint)!SUB81(uVar60 >> 7,0) * auVar84._28_4_;
        bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar60 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar102._0_4_ =
             (uint)(bVar59 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar19._0_4_;
        bVar14 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar102._4_4_ = (uint)bVar14 * auVar93._4_4_ | (uint)!bVar14 * auVar19._4_4_;
        bVar14 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar102._8_4_ = (uint)bVar14 * auVar93._8_4_ | (uint)!bVar14 * auVar19._8_4_;
        bVar14 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar102._12_4_ = (uint)bVar14 * auVar93._12_4_ | (uint)!bVar14 * auVar19._12_4_;
        auVar102._16_4_ = (uint)((byte)(uVar60 >> 4) & 1) * auVar93._16_4_;
        auVar102._20_4_ = (uint)((byte)(uVar60 >> 5) & 1) * auVar93._20_4_;
        auVar102._24_4_ = (uint)((byte)(uVar60 >> 6) & 1) * auVar93._24_4_;
        iVar2 = (uint)(byte)(uVar60 >> 7) * auVar93._28_4_;
        auVar102._28_4_ = iVar2;
        auVar81 = vsubps_avx512vl(auVar101,auVar89);
        auVar93 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar76._12_4_ |
                                                (uint)!bVar16 * auVar190._12_4_,
                                                CONCAT48((uint)bVar15 * (int)auVar76._8_4_ |
                                                         (uint)!bVar15 * auVar190._8_4_,
                                                         CONCAT44((uint)bVar13 * (int)auVar76._4_4_
                                                                  | (uint)!bVar13 * auVar190._4_4_,
                                                                  (uint)(bVar59 & 1) *
                                                                  (int)auVar76._0_4_ |
                                                                  (uint)!(bool)(bVar59 & 1) *
                                                                  auVar190._0_4_)))),auVar80);
        auVar91 = vsubps_avx(auVar102,auVar88);
        auVar90 = vsubps_avx(auVar89,auVar94);
        auVar78 = vsubps_avx(auVar80,auVar99);
        auVar79 = vsubps_avx(auVar88,auVar100);
        auVar82._4_4_ = auVar91._4_4_ * fVar116;
        auVar82._0_4_ = auVar91._0_4_ * fVar68;
        auVar82._8_4_ = auVar91._8_4_ * fVar118;
        auVar82._12_4_ = auVar91._12_4_ * fVar120;
        auVar82._16_4_ = auVar91._16_4_ * 0.0;
        auVar82._20_4_ = auVar91._20_4_ * 0.0;
        auVar82._24_4_ = auVar91._24_4_ * 0.0;
        auVar82._28_4_ = iVar2;
        auVar73 = vfmsub231ps_fma(auVar82,auVar88,auVar81);
        auVar84._4_4_ = fVar117 * auVar81._4_4_;
        auVar84._0_4_ = fVar69 * auVar81._0_4_;
        auVar84._8_4_ = fVar119 * auVar81._8_4_;
        auVar84._12_4_ = fVar121 * auVar81._12_4_;
        auVar84._16_4_ = auVar81._16_4_ * 0.0;
        auVar84._20_4_ = auVar81._20_4_ * 0.0;
        auVar84._24_4_ = auVar81._24_4_ * 0.0;
        auVar84._28_4_ = auVar92._28_4_;
        auVar191 = vfmsub231ps_fma(auVar84,auVar89,auVar93);
        auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar191),auVar95,ZEXT1632(auVar73));
        auVar158._0_4_ = auVar93._0_4_ * auVar88._0_4_;
        auVar158._4_4_ = auVar93._4_4_ * auVar88._4_4_;
        auVar158._8_4_ = auVar93._8_4_ * auVar88._8_4_;
        auVar158._12_4_ = auVar93._12_4_ * auVar88._12_4_;
        auVar158._16_4_ = auVar93._16_4_ * fVar149;
        auVar158._20_4_ = auVar93._20_4_ * fVar135;
        auVar158._24_4_ = auVar93._24_4_ * fVar136;
        auVar158._28_4_ = 0;
        auVar73 = vfmsub231ps_fma(auVar158,auVar80,auVar91);
        auVar82 = vfmadd231ps_avx512vl(auVar92,auVar95,ZEXT1632(auVar73));
        auVar92 = vmulps_avx512vl(auVar79,auVar94);
        auVar92 = vfmsub231ps_avx512vl(auVar92,auVar90,auVar100);
        auVar85._4_4_ = auVar78._4_4_ * auVar100._4_4_;
        auVar85._0_4_ = auVar78._0_4_ * auVar100._0_4_;
        auVar85._8_4_ = auVar78._8_4_ * auVar100._8_4_;
        auVar85._12_4_ = auVar78._12_4_ * auVar100._12_4_;
        auVar85._16_4_ = auVar78._16_4_ * auVar100._16_4_;
        auVar85._20_4_ = auVar78._20_4_ * auVar100._20_4_;
        auVar85._24_4_ = auVar78._24_4_ * auVar100._24_4_;
        auVar85._28_4_ = auVar100._28_4_;
        auVar73 = vfmsub231ps_fma(auVar85,auVar99,auVar79);
        auVar159._0_4_ = auVar99._0_4_ * auVar90._0_4_;
        auVar159._4_4_ = auVar99._4_4_ * auVar90._4_4_;
        auVar159._8_4_ = auVar99._8_4_ * auVar90._8_4_;
        auVar159._12_4_ = auVar99._12_4_ * auVar90._12_4_;
        auVar159._16_4_ = fVar171 * auVar90._16_4_;
        auVar159._20_4_ = fVar167 * auVar90._20_4_;
        auVar159._24_4_ = fVar168 * auVar90._24_4_;
        auVar159._28_4_ = 0;
        auVar191 = vfmsub231ps_fma(auVar159,auVar78,auVar94);
        auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar191),auVar95,auVar92);
        auVar84 = vfmadd231ps_avx512vl(auVar92,auVar95,ZEXT1632(auVar73));
        auVar92 = vmaxps_avx(auVar82,auVar84);
        uVar137 = vcmpps_avx512vl(auVar92,auVar95,2);
        bVar67 = bVar67 & (byte)uVar137;
        auVar193 = ZEXT3264(local_7c0);
        auVar194 = ZEXT3264(local_760);
        auVar195 = ZEXT3264(local_7e0);
        auVar196 = ZEXT3264(local_800);
        auVar197 = ZEXT3264(local_820);
        auVar200 = ZEXT3264(local_880);
        auVar199 = ZEXT3264(local_780);
        if (bVar67 == 0) {
          uVar62 = 0;
          auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar134 = ZEXT3264(auVar92);
        }
        else {
          auVar85 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x200)));
          auVar189 = ZEXT3264(auVar85);
          auVar34._4_4_ = auVar79._4_4_ * auVar93._4_4_;
          auVar34._0_4_ = auVar79._0_4_ * auVar93._0_4_;
          auVar34._8_4_ = auVar79._8_4_ * auVar93._8_4_;
          auVar34._12_4_ = auVar79._12_4_ * auVar93._12_4_;
          auVar34._16_4_ = auVar79._16_4_ * auVar93._16_4_;
          auVar34._20_4_ = auVar79._20_4_ * auVar93._20_4_;
          auVar34._24_4_ = auVar79._24_4_ * auVar93._24_4_;
          auVar34._28_4_ = auVar92._28_4_;
          auVar190 = vfmsub231ps_fma(auVar34,auVar78,auVar91);
          auVar35._4_4_ = auVar91._4_4_ * auVar90._4_4_;
          auVar35._0_4_ = auVar91._0_4_ * auVar90._0_4_;
          auVar35._8_4_ = auVar91._8_4_ * auVar90._8_4_;
          auVar35._12_4_ = auVar91._12_4_ * auVar90._12_4_;
          auVar35._16_4_ = auVar91._16_4_ * auVar90._16_4_;
          auVar35._20_4_ = auVar91._20_4_ * auVar90._20_4_;
          auVar35._24_4_ = auVar91._24_4_ * auVar90._24_4_;
          auVar35._28_4_ = auVar91._28_4_;
          auVar191 = vfmsub231ps_fma(auVar35,auVar81,auVar79);
          auVar36._4_4_ = auVar78._4_4_ * auVar81._4_4_;
          auVar36._0_4_ = auVar78._0_4_ * auVar81._0_4_;
          auVar36._8_4_ = auVar78._8_4_ * auVar81._8_4_;
          auVar36._12_4_ = auVar78._12_4_ * auVar81._12_4_;
          auVar36._16_4_ = auVar78._16_4_ * auVar81._16_4_;
          auVar36._20_4_ = auVar78._20_4_ * auVar81._20_4_;
          auVar36._24_4_ = auVar78._24_4_ * auVar81._24_4_;
          auVar36._28_4_ = auVar78._28_4_;
          auVar19 = vfmsub231ps_fma(auVar36,auVar90,auVar93);
          auVar73 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar191),ZEXT1632(auVar19));
          auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar73),ZEXT1632(auVar190),auVar95);
          auVar93 = vrcp14ps_avx512vl(auVar92);
          auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar134 = ZEXT3264(auVar91);
          auVar90 = vfnmadd213ps_avx512vl(auVar93,auVar92,auVar91);
          auVar73 = vfmadd132ps_fma(auVar90,auVar93,auVar93);
          auVar37._4_4_ = auVar19._4_4_ * auVar88._4_4_;
          auVar37._0_4_ = auVar19._0_4_ * auVar88._0_4_;
          auVar37._8_4_ = auVar19._8_4_ * auVar88._8_4_;
          auVar37._12_4_ = auVar19._12_4_ * auVar88._12_4_;
          auVar37._16_4_ = fVar149 * 0.0;
          auVar37._20_4_ = fVar135 * 0.0;
          auVar37._24_4_ = fVar136 * 0.0;
          auVar37._28_4_ = iVar1;
          auVar191 = vfmadd231ps_fma(auVar37,auVar80,ZEXT1632(auVar191));
          auVar191 = vfmadd231ps_fma(ZEXT1632(auVar191),auVar89,ZEXT1632(auVar190));
          fVar149 = auVar73._0_4_;
          fVar135 = auVar73._4_4_;
          fVar136 = auVar73._8_4_;
          fVar168 = auVar73._12_4_;
          local_620 = ZEXT1632(CONCAT412(auVar191._12_4_ * fVar168,
                                         CONCAT48(auVar191._8_4_ * fVar136,
                                                  CONCAT44(auVar191._4_4_ * fVar135,
                                                           auVar191._0_4_ * fVar149))));
          auVar174._4_4_ = uVar64;
          auVar174._0_4_ = uVar64;
          auVar174._8_4_ = uVar64;
          auVar174._12_4_ = uVar64;
          auVar174._16_4_ = uVar64;
          auVar174._20_4_ = uVar64;
          auVar174._24_4_ = uVar64;
          auVar174._28_4_ = uVar64;
          uVar137 = vcmpps_avx512vl(local_620,auVar85,2);
          uVar24 = vcmpps_avx512vl(auVar174,local_620,2);
          bVar67 = (byte)uVar137 & (byte)uVar24 & bVar67;
          auVar180 = ZEXT3264(auVar83);
          if (bVar67 != 0) {
            uVar137 = vcmpps_avx512vl(auVar92,auVar95,4);
            bVar67 = bVar67 & (byte)uVar137;
            if (bVar67 != 0) {
              fVar167 = auVar82._0_4_ * fVar149;
              fVar171 = auVar82._4_4_ * fVar135;
              auVar38._4_4_ = fVar171;
              auVar38._0_4_ = fVar167;
              fVar68 = auVar82._8_4_ * fVar136;
              auVar38._8_4_ = fVar68;
              fVar69 = auVar82._12_4_ * fVar168;
              auVar38._12_4_ = fVar69;
              fVar116 = auVar82._16_4_ * 0.0;
              auVar38._16_4_ = fVar116;
              fVar117 = auVar82._20_4_ * 0.0;
              auVar38._20_4_ = fVar117;
              fVar118 = auVar82._24_4_ * 0.0;
              auVar38._24_4_ = fVar118;
              auVar38._28_4_ = auVar92._28_4_;
              auVar93 = vsubps_avx512vl(auVar91,auVar38);
              local_660._0_4_ =
                   (float)((uint)(bVar59 & 1) * (int)fVar167 |
                          (uint)!(bool)(bVar59 & 1) * auVar93._0_4_);
              bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
              local_660._4_4_ = (float)((uint)bVar13 * (int)fVar171 | (uint)!bVar13 * auVar93._4_4_)
              ;
              bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
              local_660._8_4_ = (float)((uint)bVar13 * (int)fVar68 | (uint)!bVar13 * auVar93._8_4_);
              bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
              local_660._12_4_ =
                   (float)((uint)bVar13 * (int)fVar69 | (uint)!bVar13 * auVar93._12_4_);
              bVar13 = (bool)((byte)(uVar60 >> 4) & 1);
              local_660._16_4_ =
                   (float)((uint)bVar13 * (int)fVar116 | (uint)!bVar13 * auVar93._16_4_);
              bVar13 = (bool)((byte)(uVar60 >> 5) & 1);
              local_660._20_4_ =
                   (float)((uint)bVar13 * (int)fVar117 | (uint)!bVar13 * auVar93._20_4_);
              bVar13 = (bool)((byte)(uVar60 >> 6) & 1);
              local_660._24_4_ =
                   (float)((uint)bVar13 * (int)fVar118 | (uint)!bVar13 * auVar93._24_4_);
              bVar13 = SUB81(uVar60 >> 7,0);
              local_660._28_4_ =
                   (float)((uint)bVar13 * auVar92._28_4_ | (uint)!bVar13 * auVar93._28_4_);
              auVar92 = vsubps_avx(ZEXT1632(auVar23),auVar86);
              auVar73 = vfmadd213ps_fma(auVar92,local_660,auVar86);
              uVar125 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar86._4_4_ = uVar125;
              auVar86._0_4_ = uVar125;
              auVar86._8_4_ = uVar125;
              auVar86._12_4_ = uVar125;
              auVar86._16_4_ = uVar125;
              auVar86._20_4_ = uVar125;
              auVar86._24_4_ = uVar125;
              auVar86._28_4_ = uVar125;
              auVar92 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar73._12_4_ + auVar73._12_4_,
                                                           CONCAT48(auVar73._8_4_ + auVar73._8_4_,
                                                                    CONCAT44(auVar73._4_4_ +
                                                                             auVar73._4_4_,
                                                                             auVar73._0_4_ +
                                                                             auVar73._0_4_)))),
                                        auVar86);
              uVar137 = vcmpps_avx512vl(local_620,auVar92,6);
              if (((byte)uVar137 & bVar67) != 0) {
                auVar154._0_4_ = auVar84._0_4_ * fVar149;
                auVar154._4_4_ = auVar84._4_4_ * fVar135;
                auVar154._8_4_ = auVar84._8_4_ * fVar136;
                auVar154._12_4_ = auVar84._12_4_ * fVar168;
                auVar154._16_4_ = auVar84._16_4_ * 0.0;
                auVar154._20_4_ = auVar84._20_4_ * 0.0;
                auVar154._24_4_ = auVar84._24_4_ * 0.0;
                auVar154._28_4_ = 0;
                auVar92 = vsubps_avx512vl(auVar91,auVar154);
                auVar103._0_4_ =
                     (uint)(bVar59 & 1) * (int)auVar154._0_4_ |
                     (uint)!(bool)(bVar59 & 1) * auVar92._0_4_;
                bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
                auVar103._4_4_ = (uint)bVar13 * (int)auVar154._4_4_ | (uint)!bVar13 * auVar92._4_4_;
                bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
                auVar103._8_4_ = (uint)bVar13 * (int)auVar154._8_4_ | (uint)!bVar13 * auVar92._8_4_;
                bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
                auVar103._12_4_ =
                     (uint)bVar13 * (int)auVar154._12_4_ | (uint)!bVar13 * auVar92._12_4_;
                bVar13 = (bool)((byte)(uVar60 >> 4) & 1);
                auVar103._16_4_ =
                     (uint)bVar13 * (int)auVar154._16_4_ | (uint)!bVar13 * auVar92._16_4_;
                bVar13 = (bool)((byte)(uVar60 >> 5) & 1);
                auVar103._20_4_ =
                     (uint)bVar13 * (int)auVar154._20_4_ | (uint)!bVar13 * auVar92._20_4_;
                bVar13 = (bool)((byte)(uVar60 >> 6) & 1);
                auVar103._24_4_ =
                     (uint)bVar13 * (int)auVar154._24_4_ | (uint)!bVar13 * auVar92._24_4_;
                auVar103._28_4_ = (uint)!SUB81(uVar60 >> 7,0) * auVar92._28_4_;
                auVar31._8_4_ = 0x40000000;
                auVar31._0_8_ = 0x4000000040000000;
                auVar31._12_4_ = 0x40000000;
                auVar31._16_4_ = 0x40000000;
                auVar31._20_4_ = 0x40000000;
                auVar31._24_4_ = 0x40000000;
                auVar31._28_4_ = 0x40000000;
                local_640 = vfmsub132ps_avx512vl(auVar103,auVar91,auVar31);
                local_600 = 0;
                local_5f0 = local_8c0._0_8_;
                uStack_5e8 = local_8c0._8_8_;
                local_5e0 = local_8d0._0_8_;
                uStack_5d8 = local_8d0._8_8_;
                local_5d0 = local_8e0._0_8_;
                uStack_5c8 = local_8e0._8_8_;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (uVar62 = CONCAT71((int7)(uVar62 >> 8),1),
                     pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar149 = 1.0 / auVar87._0_4_;
                    local_5a0[0] = fVar149 * (local_660._0_4_ + 0.0);
                    local_5a0[1] = fVar149 * (local_660._4_4_ + 1.0);
                    local_5a0[2] = fVar149 * (local_660._8_4_ + 2.0);
                    local_5a0[3] = fVar149 * (local_660._12_4_ + 3.0);
                    fStack_590 = fVar149 * (local_660._16_4_ + 4.0);
                    fStack_58c = fVar149 * (local_660._20_4_ + 5.0);
                    fStack_588 = fVar149 * (local_660._24_4_ + 6.0);
                    fStack_584 = local_660._28_4_ + 7.0;
                    local_580 = local_640;
                    local_560 = local_620;
                    lVar65 = 0;
                    uVar63 = (ulong)((byte)uVar137 & bVar67);
                    for (uVar60 = uVar63; (uVar60 & 1) == 0;
                        uVar60 = uVar60 >> 1 | 0x8000000000000000) {
                      lVar65 = lVar65 + 1;
                    }
                    auVar134 = vpbroadcastd_avx512f();
                    _local_440 = vmovdqa64_avx512f(auVar134);
                    auVar134 = vpbroadcastd_avx512f();
                    local_540 = vmovdqa64_avx512f(auVar134);
                    local_860 = auVar83;
                    local_7a0 = auVar85;
                    local_5fc = iVar8;
                    do {
                      auVar190 = auVar192._0_16_;
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_5a0[lVar65]));
                      local_6a0 = (float)lVar65;
                      fStack_69c = (float)((ulong)lVar65 >> 0x20);
                      local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_580 + lVar65 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_560 + lVar65 * 4)
                      ;
                      local_910.context = context->user;
                      fVar168 = local_200._0_4_;
                      fVar135 = 1.0 - fVar168;
                      fVar149 = fVar135 * fVar135 * -3.0;
                      auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar135 * fVar135)),
                                                ZEXT416((uint)(fVar168 * fVar135)),
                                                ZEXT416(0xc0000000));
                      auVar191 = vfmsub132ss_fma(ZEXT416((uint)(fVar168 * fVar135)),
                                                 ZEXT416((uint)(fVar168 * fVar168)),
                                                 ZEXT416(0x40000000));
                      fVar135 = auVar73._0_4_ * 3.0;
                      fVar136 = auVar191._0_4_ * 3.0;
                      fVar168 = fVar168 * fVar168 * 3.0;
                      auVar165._0_4_ = fVar168 * (float)local_730._0_4_;
                      auVar165._4_4_ = fVar168 * (float)local_730._4_4_;
                      auVar165._8_4_ = fVar168 * fStack_728;
                      auVar165._12_4_ = fVar168 * fStack_724;
                      auVar130._4_4_ = fVar136;
                      auVar130._0_4_ = fVar136;
                      auVar130._8_4_ = fVar136;
                      auVar130._12_4_ = fVar136;
                      auVar73 = vfmadd132ps_fma(auVar130,auVar165,local_8e0);
                      auVar152._4_4_ = fVar135;
                      auVar152._0_4_ = fVar135;
                      auVar152._8_4_ = fVar135;
                      auVar152._12_4_ = fVar135;
                      auVar73 = vfmadd132ps_fma(auVar152,auVar73,local_8d0);
                      auVar131._4_4_ = fVar149;
                      auVar131._0_4_ = fVar149;
                      auVar131._8_4_ = fVar149;
                      auVar131._12_4_ = fVar149;
                      auVar73 = vfmadd132ps_fma(auVar131,auVar73,local_8c0);
                      auVar134 = vbroadcastss_avx512f(auVar73);
                      auVar114 = vbroadcastss_avx512f(ZEXT416(1));
                      local_280 = vpermps_avx512f(auVar114,ZEXT1664(auVar73));
                      auVar114 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar114,ZEXT1664(auVar73));
                      local_2c0[0] = (RTCHitN)auVar134[0];
                      local_2c0[1] = (RTCHitN)auVar134[1];
                      local_2c0[2] = (RTCHitN)auVar134[2];
                      local_2c0[3] = (RTCHitN)auVar134[3];
                      local_2c0[4] = (RTCHitN)auVar134[4];
                      local_2c0[5] = (RTCHitN)auVar134[5];
                      local_2c0[6] = (RTCHitN)auVar134[6];
                      local_2c0[7] = (RTCHitN)auVar134[7];
                      local_2c0[8] = (RTCHitN)auVar134[8];
                      local_2c0[9] = (RTCHitN)auVar134[9];
                      local_2c0[10] = (RTCHitN)auVar134[10];
                      local_2c0[0xb] = (RTCHitN)auVar134[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar134[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar134[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar134[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar134[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar134[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar134[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar134[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar134[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar134[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar134[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar134[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar134[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar134[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar134[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar134[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar134[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar134[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar134[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar134[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar134[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar134[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar134[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar134[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar134[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar134[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar134[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar134[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar134[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar134[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar134[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar134[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar134[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar134[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar134[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar134[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar134[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar134[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar134[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar134[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar134[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar134[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar134[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar134[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar134[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar134[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar134[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar134[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar134[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar134[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar134[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar134[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar134[0x3f];
                      local_180 = local_540._0_8_;
                      uStack_178 = local_540._8_8_;
                      uStack_170 = local_540._16_8_;
                      uStack_168 = local_540._24_8_;
                      uStack_160 = local_540._32_8_;
                      uStack_158 = local_540._40_8_;
                      uStack_150 = local_540._48_8_;
                      uStack_148 = local_540._56_8_;
                      auVar134 = vmovdqa64_avx512f(_local_440);
                      local_140 = vmovdqa64_avx512f(auVar134);
                      vpcmpeqd_avx2(auVar134._0_32_,auVar134._0_32_);
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_910.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_910.context)->instPrimID[0]));
                      auVar114 = vmovdqa64_avx512f(local_300);
                      local_700 = vmovdqa64_avx512f(auVar114);
                      local_910.valid = (int *)local_700;
                      local_910.geometryUserPtr = pGVar9->userPtr;
                      local_910.hit = local_2c0;
                      local_910.N = 0x10;
                      local_720 = (uint)uVar63;
                      uStack_71c = (uint)(uVar63 >> 0x20);
                      local_910.ray = (RTCRayN *)ray;
                      if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar9->occlusionFilterN)(&local_910);
                        uVar63 = CONCAT44(uStack_71c,local_720);
                        auVar189 = ZEXT3264(local_7a0);
                        auVar180 = ZEXT3264(local_860);
                        auVar199 = ZEXT3264(local_780);
                        auVar200 = ZEXT3264(local_880);
                        auVar198 = ZEXT3264(local_840);
                        auVar197 = ZEXT3264(local_820);
                        auVar196 = ZEXT3264(local_800);
                        auVar195 = ZEXT3264(local_7e0);
                        auVar194 = ZEXT3264(local_760);
                        auVar193 = ZEXT3264(local_7c0);
                        auVar73 = vxorps_avx512vl(auVar190,auVar190);
                        auVar192 = ZEXT1664(auVar73);
                        auVar114 = vmovdqa64_avx512f(local_700);
                        uVar64 = local_8a0._0_4_;
                      }
                      auVar73 = auVar192._0_16_;
                      uVar137 = vptestmd_avx512f(auVar114,auVar114);
                      local_940 = auVar74;
                      if ((short)uVar137 == 0) {
                        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar134 = ZEXT3264(auVar92);
                      }
                      else {
                        p_Var12 = context->args->filter;
                        if (p_Var12 == (RTCFilterFunctionN)0x0) {
                          auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar134 = ZEXT3264(auVar92);
                        }
                        else {
                          auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar134 = ZEXT3264(auVar92);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var12)(&local_910);
                            uVar63 = CONCAT44(uStack_71c,local_720);
                            auVar189 = ZEXT3264(local_7a0);
                            auVar180 = ZEXT3264(local_860);
                            auVar199 = ZEXT3264(local_780);
                            auVar200 = ZEXT3264(local_880);
                            auVar198 = ZEXT3264(local_840);
                            auVar197 = ZEXT3264(local_820);
                            auVar196 = ZEXT3264(local_800);
                            auVar195 = ZEXT3264(local_7e0);
                            auVar194 = ZEXT3264(local_760);
                            auVar193 = ZEXT3264(local_7c0);
                            auVar73 = vxorps_avx512vl(auVar73,auVar73);
                            auVar192 = ZEXT1664(auVar73);
                            auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar134 = ZEXT3264(auVar92);
                            auVar114 = vmovdqa64_avx512f(local_700);
                            uVar64 = local_8a0._0_4_;
                          }
                        }
                        auVar83 = auVar180._0_32_;
                        uVar60 = vptestmd_avx512f(auVar114,auVar114);
                        auVar115 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                        bVar13 = (bool)((byte)uVar60 & 1);
                        auVar114._0_4_ =
                             (uint)bVar13 * auVar115._0_4_ |
                             (uint)!bVar13 * *(int *)(local_910.ray + 0x200);
                        bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
                        auVar114._4_4_ =
                             (uint)bVar13 * auVar115._4_4_ |
                             (uint)!bVar13 * *(int *)(local_910.ray + 0x204);
                        bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
                        auVar114._8_4_ =
                             (uint)bVar13 * auVar115._8_4_ |
                             (uint)!bVar13 * *(int *)(local_910.ray + 0x208);
                        bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
                        auVar114._12_4_ =
                             (uint)bVar13 * auVar115._12_4_ |
                             (uint)!bVar13 * *(int *)(local_910.ray + 0x20c);
                        bVar13 = (bool)((byte)(uVar60 >> 4) & 1);
                        auVar114._16_4_ =
                             (uint)bVar13 * auVar115._16_4_ |
                             (uint)!bVar13 * *(int *)(local_910.ray + 0x210);
                        bVar13 = (bool)((byte)(uVar60 >> 5) & 1);
                        auVar114._20_4_ =
                             (uint)bVar13 * auVar115._20_4_ |
                             (uint)!bVar13 * *(int *)(local_910.ray + 0x214);
                        bVar13 = (bool)((byte)(uVar60 >> 6) & 1);
                        auVar114._24_4_ =
                             (uint)bVar13 * auVar115._24_4_ |
                             (uint)!bVar13 * *(int *)(local_910.ray + 0x218);
                        bVar13 = (bool)((byte)(uVar60 >> 7) & 1);
                        auVar114._28_4_ =
                             (uint)bVar13 * auVar115._28_4_ |
                             (uint)!bVar13 * *(int *)(local_910.ray + 0x21c);
                        bVar13 = (bool)((byte)(uVar60 >> 8) & 1);
                        auVar114._32_4_ =
                             (uint)bVar13 * auVar115._32_4_ |
                             (uint)!bVar13 * *(int *)(local_910.ray + 0x220);
                        bVar13 = (bool)((byte)(uVar60 >> 9) & 1);
                        auVar114._36_4_ =
                             (uint)bVar13 * auVar115._36_4_ |
                             (uint)!bVar13 * *(int *)(local_910.ray + 0x224);
                        bVar13 = (bool)((byte)(uVar60 >> 10) & 1);
                        auVar114._40_4_ =
                             (uint)bVar13 * auVar115._40_4_ |
                             (uint)!bVar13 * *(int *)(local_910.ray + 0x228);
                        bVar13 = (bool)((byte)(uVar60 >> 0xb) & 1);
                        auVar114._44_4_ =
                             (uint)bVar13 * auVar115._44_4_ |
                             (uint)!bVar13 * *(int *)(local_910.ray + 0x22c);
                        bVar13 = (bool)((byte)(uVar60 >> 0xc) & 1);
                        auVar114._48_4_ =
                             (uint)bVar13 * auVar115._48_4_ |
                             (uint)!bVar13 * *(int *)(local_910.ray + 0x230);
                        bVar13 = (bool)((byte)(uVar60 >> 0xd) & 1);
                        auVar114._52_4_ =
                             (uint)bVar13 * auVar115._52_4_ |
                             (uint)!bVar13 * *(int *)(local_910.ray + 0x234);
                        bVar13 = (bool)((byte)(uVar60 >> 0xe) & 1);
                        auVar114._56_4_ =
                             (uint)bVar13 * auVar115._56_4_ |
                             (uint)!bVar13 * *(int *)(local_910.ray + 0x238);
                        bVar13 = SUB81(uVar60 >> 0xf,0);
                        auVar114._60_4_ =
                             (uint)bVar13 * auVar115._60_4_ |
                             (uint)!bVar13 * *(int *)(local_910.ray + 0x23c);
                        *(undefined1 (*) [64])(local_910.ray + 0x200) = auVar114;
                        if ((short)uVar60 != 0) {
                          uVar62 = CONCAT71((int7)(uVar62 >> 8),1);
                          break;
                        }
                      }
                      auVar83 = auVar180._0_32_;
                      *(int *)(ray + k * 4 + 0x200) = auVar189._0_4_;
                      uVar62 = 0;
                      lVar65 = 0;
                      uVar63 = uVar63 ^ 1L << ((ulong)(uint)local_6a0 & 0x3f);
                      for (uVar60 = uVar63; (uVar60 & 1) == 0;
                          uVar60 = uVar60 >> 1 | 0x8000000000000000) {
                        lVar65 = lVar65 + 1;
                      }
                    } while (uVar63 != 0);
                  }
                  goto LAB_01bf70c3;
                }
              }
            }
          }
          uVar62 = 0;
        }
      }
LAB_01bf70c3:
      auVar180 = _local_440;
      if (8 < iVar8) {
        local_8a0 = vpbroadcastd_avx512vl();
        local_440._4_4_ = 1.0 / (float)local_4c0._0_4_;
        local_440._0_4_ = local_440._4_4_;
        fStack_438 = (float)local_440._4_4_;
        fStack_434 = (float)local_440._4_4_;
        fStack_430 = (float)local_440._4_4_;
        fStack_42c = (float)local_440._4_4_;
        fStack_428 = (float)local_440._4_4_;
        auStack_420 = auVar180._32_32_;
        fStack_424 = (float)local_440._4_4_;
        auVar180 = vpbroadcastd_avx512f();
        local_4c0 = vmovdqa64_avx512f(auVar180);
        auVar180 = vpbroadcastd_avx512f();
        local_480 = vmovdqa64_avx512f(auVar180);
        lVar65 = 8;
        local_860 = auVar83;
        local_720 = uVar64;
        uStack_71c = uVar64;
        uStack_718 = uVar64;
        uStack_714 = uVar64;
        uStack_710 = uVar64;
        uStack_70c = uVar64;
        uStack_708 = uVar64;
        uStack_704 = uVar64;
        local_6a0 = fVar124;
        fStack_69c = fVar124;
        fStack_698 = fVar124;
        fStack_694 = fVar124;
        fStack_690 = fVar124;
        fStack_68c = fVar124;
        fStack_688 = fVar124;
        fStack_684 = fVar124;
        do {
          auVar92 = vpbroadcastd_avx512vl();
          auVar78 = vpor_avx2(auVar92,_DAT_01fe9900);
          uVar24 = vpcmpd_avx512vl(auVar78,local_8a0,1);
          auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar65 * 4 + lVar25);
          auVar93 = *(undefined1 (*) [32])(lVar25 + 0x21aa768 + lVar65 * 4);
          auVar91 = *(undefined1 (*) [32])(lVar25 + 0x21aabec + lVar65 * 4);
          auVar90 = *(undefined1 (*) [32])(lVar25 + 0x21ab070 + lVar65 * 4);
          local_880 = auVar200._0_32_;
          auVar79 = vmulps_avx512vl(local_880,auVar90);
          local_780 = auVar199._0_32_;
          auVar89 = vmulps_avx512vl(local_780,auVar90);
          auVar39._4_4_ = auVar90._4_4_ * (float)local_380._4_4_;
          auVar39._0_4_ = auVar90._0_4_ * (float)local_380._0_4_;
          auVar39._8_4_ = auVar90._8_4_ * fStack_378;
          auVar39._12_4_ = auVar90._12_4_ * fStack_374;
          auVar39._16_4_ = auVar90._16_4_ * fStack_370;
          auVar39._20_4_ = auVar90._20_4_ * fStack_36c;
          auVar39._24_4_ = auVar90._24_4_ * fStack_368;
          auVar39._28_4_ = auVar78._28_4_;
          auVar98 = auVar197._0_32_;
          auVar78 = vfmadd231ps_avx512vl(auVar79,auVar91,auVar98);
          auVar99 = auVar198._0_32_;
          auVar79 = vfmadd231ps_avx512vl(auVar89,auVar91,auVar99);
          auVar89 = vfmadd231ps_avx512vl(auVar39,auVar91,local_360);
          auVar96 = auVar195._0_32_;
          auVar78 = vfmadd231ps_avx512vl(auVar78,auVar93,auVar96);
          auVar97 = auVar196._0_32_;
          auVar79 = vfmadd231ps_avx512vl(auVar79,auVar93,auVar97);
          auVar74 = vfmadd231ps_fma(auVar89,auVar93,local_340);
          auVar95 = auVar193._0_32_;
          auVar82 = vfmadd231ps_avx512vl(auVar78,auVar92,auVar95);
          local_760 = auVar194._0_32_;
          auVar84 = vfmadd231ps_avx512vl(auVar79,auVar92,local_760);
          auVar78 = *(undefined1 (*) [32])(bezier_basis1 + lVar65 * 4 + lVar25);
          auVar79 = *(undefined1 (*) [32])(lVar25 + 0x21acb88 + lVar65 * 4);
          auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar92,local_320);
          auVar89 = *(undefined1 (*) [32])(lVar25 + 0x21ad00c + lVar65 * 4);
          auVar80 = *(undefined1 (*) [32])(lVar25 + 0x21ad490 + lVar65 * 4);
          auVar83 = vmulps_avx512vl(local_880,auVar80);
          auVar81 = vmulps_avx512vl(local_780,auVar80);
          auVar40._4_4_ = auVar80._4_4_ * (float)local_380._4_4_;
          auVar40._0_4_ = auVar80._0_4_ * (float)local_380._0_4_;
          auVar40._8_4_ = auVar80._8_4_ * fStack_378;
          auVar40._12_4_ = auVar80._12_4_ * fStack_374;
          auVar40._16_4_ = auVar80._16_4_ * fStack_370;
          auVar40._20_4_ = auVar80._20_4_ * fStack_36c;
          auVar40._24_4_ = auVar80._24_4_ * fStack_368;
          auVar40._28_4_ = uStack_364;
          auVar83 = vfmadd231ps_avx512vl(auVar83,auVar89,auVar98);
          auVar81 = vfmadd231ps_avx512vl(auVar81,auVar89,auVar99);
          auVar85 = vfmadd231ps_avx512vl(auVar40,auVar89,local_360);
          auVar83 = vfmadd231ps_avx512vl(auVar83,auVar79,auVar96);
          auVar81 = vfmadd231ps_avx512vl(auVar81,auVar79,auVar97);
          auVar73 = vfmadd231ps_fma(auVar85,auVar79,local_340);
          auVar85 = vfmadd231ps_avx512vl(auVar83,auVar78,auVar95);
          auVar86 = vfmadd231ps_avx512vl(auVar81,auVar78,local_760);
          auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar78,local_320);
          auVar87 = vmaxps_avx512vl(ZEXT1632(auVar74),ZEXT1632(auVar73));
          auVar83 = vsubps_avx(auVar85,auVar82);
          auVar81 = vsubps_avx(auVar86,auVar84);
          auVar88 = vmulps_avx512vl(auVar84,auVar83);
          auVar94 = vmulps_avx512vl(auVar82,auVar81);
          auVar88 = vsubps_avx512vl(auVar88,auVar94);
          auVar94 = vmulps_avx512vl(auVar81,auVar81);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar83,auVar83);
          auVar87 = vmulps_avx512vl(auVar87,auVar87);
          auVar87 = vmulps_avx512vl(auVar87,auVar94);
          auVar88 = vmulps_avx512vl(auVar88,auVar88);
          uVar137 = vcmpps_avx512vl(auVar88,auVar87,2);
          bVar67 = (byte)uVar24 & (byte)uVar137;
          if (bVar67 != 0) {
            auVar80 = vmulps_avx512vl(local_860,auVar80);
            auVar89 = vfmadd213ps_avx512vl(auVar89,local_3e0,auVar80);
            auVar79 = vfmadd213ps_avx512vl(auVar79,local_3c0,auVar89);
            auVar78 = vfmadd213ps_avx512vl(auVar78,local_3a0,auVar79);
            auVar90 = vmulps_avx512vl(local_860,auVar90);
            auVar91 = vfmadd213ps_avx512vl(auVar91,local_3e0,auVar90);
            auVar93 = vfmadd213ps_avx512vl(auVar93,local_3c0,auVar91);
            auVar79 = vfmadd213ps_avx512vl(auVar92,local_3a0,auVar93);
            auVar92 = *(undefined1 (*) [32])(lVar25 + 0x21ab4f4 + lVar65 * 4);
            auVar93 = *(undefined1 (*) [32])(lVar25 + 0x21ab978 + lVar65 * 4);
            auVar91 = *(undefined1 (*) [32])(lVar25 + 0x21abdfc + lVar65 * 4);
            auVar90 = *(undefined1 (*) [32])(lVar25 + 0x21ac280 + lVar65 * 4);
            auVar89 = vmulps_avx512vl(local_880,auVar90);
            auVar80 = vmulps_avx512vl(local_780,auVar90);
            auVar90 = vmulps_avx512vl(local_860,auVar90);
            auVar89 = vfmadd231ps_avx512vl(auVar89,auVar91,auVar98);
            auVar80 = vfmadd231ps_avx512vl(auVar80,auVar91,auVar99);
            auVar91 = vfmadd231ps_avx512vl(auVar90,local_3e0,auVar91);
            auVar90 = vfmadd231ps_avx512vl(auVar89,auVar93,auVar96);
            auVar89 = vfmadd231ps_avx512vl(auVar80,auVar93,auVar97);
            auVar93 = vfmadd231ps_avx512vl(auVar91,local_3c0,auVar93);
            auVar90 = vfmadd231ps_avx512vl(auVar90,auVar92,auVar95);
            auVar89 = vfmadd231ps_avx512vl(auVar89,auVar92,local_760);
            auVar80 = vfmadd231ps_avx512vl(auVar93,local_3a0,auVar92);
            auVar92 = *(undefined1 (*) [32])(lVar25 + 0x21ad914 + lVar65 * 4);
            auVar93 = *(undefined1 (*) [32])(lVar25 + 0x21ae21c + lVar65 * 4);
            auVar91 = *(undefined1 (*) [32])(lVar25 + 0x21ae6a0 + lVar65 * 4);
            auVar87 = vmulps_avx512vl(local_880,auVar91);
            auVar88 = vmulps_avx512vl(local_780,auVar91);
            auVar91 = vmulps_avx512vl(local_860,auVar91);
            auVar87 = vfmadd231ps_avx512vl(auVar87,auVar93,auVar98);
            auVar88 = vfmadd231ps_avx512vl(auVar88,auVar93,auVar99);
            auVar91 = vfmadd231ps_avx512vl(auVar91,local_3e0,auVar93);
            auVar93 = *(undefined1 (*) [32])(lVar25 + 0x21add98 + lVar65 * 4);
            auVar87 = vfmadd231ps_avx512vl(auVar87,auVar93,auVar96);
            auVar88 = vfmadd231ps_avx512vl(auVar88,auVar93,auVar97);
            auVar93 = vfmadd231ps_avx512vl(auVar91,local_3c0,auVar93);
            auVar91 = vfmadd231ps_avx512vl(auVar87,auVar92,auVar95);
            auVar87 = vfmadd231ps_avx512vl(auVar88,auVar92,local_760);
            auVar93 = vfmadd231ps_avx512vl(auVar93,local_3a0,auVar92);
            auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar90,auVar88);
            vandps_avx512vl(auVar89,auVar88);
            auVar92 = vmaxps_avx(auVar88,auVar88);
            vandps_avx512vl(auVar80,auVar88);
            auVar92 = vmaxps_avx(auVar92,auVar88);
            auVar58._4_4_ = fStack_69c;
            auVar58._0_4_ = local_6a0;
            auVar58._8_4_ = fStack_698;
            auVar58._12_4_ = fStack_694;
            auVar58._16_4_ = fStack_690;
            auVar58._20_4_ = fStack_68c;
            auVar58._24_4_ = fStack_688;
            auVar58._28_4_ = fStack_684;
            uVar60 = vcmpps_avx512vl(auVar92,auVar58,1);
            bVar13 = (bool)((byte)uVar60 & 1);
            auVar104._0_4_ = (float)((uint)bVar13 * auVar83._0_4_ | (uint)!bVar13 * auVar90._0_4_);
            bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar104._4_4_ = (float)((uint)bVar13 * auVar83._4_4_ | (uint)!bVar13 * auVar90._4_4_);
            bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar104._8_4_ = (float)((uint)bVar13 * auVar83._8_4_ | (uint)!bVar13 * auVar90._8_4_);
            bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar104._12_4_ =
                 (float)((uint)bVar13 * auVar83._12_4_ | (uint)!bVar13 * auVar90._12_4_);
            bVar13 = (bool)((byte)(uVar60 >> 4) & 1);
            auVar104._16_4_ =
                 (float)((uint)bVar13 * auVar83._16_4_ | (uint)!bVar13 * auVar90._16_4_);
            bVar13 = (bool)((byte)(uVar60 >> 5) & 1);
            auVar104._20_4_ =
                 (float)((uint)bVar13 * auVar83._20_4_ | (uint)!bVar13 * auVar90._20_4_);
            bVar13 = (bool)((byte)(uVar60 >> 6) & 1);
            auVar104._24_4_ =
                 (float)((uint)bVar13 * auVar83._24_4_ | (uint)!bVar13 * auVar90._24_4_);
            bVar13 = SUB81(uVar60 >> 7,0);
            auVar104._28_4_ = (uint)bVar13 * auVar83._28_4_ | (uint)!bVar13 * auVar90._28_4_;
            bVar13 = (bool)((byte)uVar60 & 1);
            auVar105._0_4_ = (float)((uint)bVar13 * auVar81._0_4_ | (uint)!bVar13 * auVar89._0_4_);
            bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar105._4_4_ = (float)((uint)bVar13 * auVar81._4_4_ | (uint)!bVar13 * auVar89._4_4_);
            bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar105._8_4_ = (float)((uint)bVar13 * auVar81._8_4_ | (uint)!bVar13 * auVar89._8_4_);
            bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar105._12_4_ =
                 (float)((uint)bVar13 * auVar81._12_4_ | (uint)!bVar13 * auVar89._12_4_);
            bVar13 = (bool)((byte)(uVar60 >> 4) & 1);
            auVar105._16_4_ =
                 (float)((uint)bVar13 * auVar81._16_4_ | (uint)!bVar13 * auVar89._16_4_);
            bVar13 = (bool)((byte)(uVar60 >> 5) & 1);
            auVar105._20_4_ =
                 (float)((uint)bVar13 * auVar81._20_4_ | (uint)!bVar13 * auVar89._20_4_);
            bVar13 = (bool)((byte)(uVar60 >> 6) & 1);
            auVar105._24_4_ =
                 (float)((uint)bVar13 * auVar81._24_4_ | (uint)!bVar13 * auVar89._24_4_);
            bVar13 = SUB81(uVar60 >> 7,0);
            auVar105._28_4_ = (uint)bVar13 * auVar81._28_4_ | (uint)!bVar13 * auVar89._28_4_;
            vandps_avx512vl(auVar91,auVar88);
            vandps_avx512vl(auVar87,auVar88);
            auVar92 = vmaxps_avx(auVar105,auVar105);
            vandps_avx512vl(auVar93,auVar88);
            auVar92 = vmaxps_avx(auVar92,auVar105);
            uVar60 = vcmpps_avx512vl(auVar92,auVar58,1);
            bVar13 = (bool)((byte)uVar60 & 1);
            auVar106._0_4_ = (uint)bVar13 * auVar83._0_4_ | (uint)!bVar13 * auVar91._0_4_;
            bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar106._4_4_ = (uint)bVar13 * auVar83._4_4_ | (uint)!bVar13 * auVar91._4_4_;
            bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar106._8_4_ = (uint)bVar13 * auVar83._8_4_ | (uint)!bVar13 * auVar91._8_4_;
            bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar106._12_4_ = (uint)bVar13 * auVar83._12_4_ | (uint)!bVar13 * auVar91._12_4_;
            bVar13 = (bool)((byte)(uVar60 >> 4) & 1);
            auVar106._16_4_ = (uint)bVar13 * auVar83._16_4_ | (uint)!bVar13 * auVar91._16_4_;
            bVar13 = (bool)((byte)(uVar60 >> 5) & 1);
            auVar106._20_4_ = (uint)bVar13 * auVar83._20_4_ | (uint)!bVar13 * auVar91._20_4_;
            bVar13 = (bool)((byte)(uVar60 >> 6) & 1);
            auVar106._24_4_ = (uint)bVar13 * auVar83._24_4_ | (uint)!bVar13 * auVar91._24_4_;
            bVar13 = SUB81(uVar60 >> 7,0);
            auVar106._28_4_ = (uint)bVar13 * auVar83._28_4_ | (uint)!bVar13 * auVar91._28_4_;
            bVar13 = (bool)((byte)uVar60 & 1);
            auVar107._0_4_ = (float)((uint)bVar13 * auVar81._0_4_ | (uint)!bVar13 * auVar87._0_4_);
            bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar107._4_4_ = (float)((uint)bVar13 * auVar81._4_4_ | (uint)!bVar13 * auVar87._4_4_);
            bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar107._8_4_ = (float)((uint)bVar13 * auVar81._8_4_ | (uint)!bVar13 * auVar87._8_4_);
            bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar107._12_4_ =
                 (float)((uint)bVar13 * auVar81._12_4_ | (uint)!bVar13 * auVar87._12_4_);
            bVar13 = (bool)((byte)(uVar60 >> 4) & 1);
            auVar107._16_4_ =
                 (float)((uint)bVar13 * auVar81._16_4_ | (uint)!bVar13 * auVar87._16_4_);
            bVar13 = (bool)((byte)(uVar60 >> 5) & 1);
            auVar107._20_4_ =
                 (float)((uint)bVar13 * auVar81._20_4_ | (uint)!bVar13 * auVar87._20_4_);
            bVar13 = (bool)((byte)(uVar60 >> 6) & 1);
            auVar107._24_4_ =
                 (float)((uint)bVar13 * auVar81._24_4_ | (uint)!bVar13 * auVar87._24_4_);
            bVar13 = SUB81(uVar60 >> 7,0);
            auVar107._28_4_ = (uint)bVar13 * auVar81._28_4_ | (uint)!bVar13 * auVar87._28_4_;
            auVar178._8_4_ = 0x80000000;
            auVar178._0_8_ = 0x8000000080000000;
            auVar178._12_4_ = 0x80000000;
            auVar178._16_4_ = 0x80000000;
            auVar178._20_4_ = 0x80000000;
            auVar178._24_4_ = 0x80000000;
            auVar178._28_4_ = 0x80000000;
            auVar92 = vxorps_avx512vl(auVar106,auVar178);
            auVar87 = auVar192._0_32_;
            auVar93 = vfmadd213ps_avx512vl(auVar104,auVar104,auVar87);
            auVar191 = vfmadd231ps_fma(auVar93,auVar105,auVar105);
            auVar93 = vrsqrt14ps_avx512vl(ZEXT1632(auVar191));
            auVar188._8_4_ = 0xbf000000;
            auVar188._0_8_ = 0xbf000000bf000000;
            auVar188._12_4_ = 0xbf000000;
            auVar188._16_4_ = 0xbf000000;
            auVar188._20_4_ = 0xbf000000;
            auVar188._24_4_ = 0xbf000000;
            auVar188._28_4_ = 0xbf000000;
            fVar124 = auVar93._0_4_;
            fVar149 = auVar93._4_4_;
            fVar135 = auVar93._8_4_;
            fVar136 = auVar93._12_4_;
            fVar168 = auVar93._16_4_;
            fVar167 = auVar93._20_4_;
            fVar171 = auVar93._24_4_;
            auVar41._4_4_ = fVar149 * fVar149 * fVar149 * auVar191._4_4_ * -0.5;
            auVar41._0_4_ = fVar124 * fVar124 * fVar124 * auVar191._0_4_ * -0.5;
            auVar41._8_4_ = fVar135 * fVar135 * fVar135 * auVar191._8_4_ * -0.5;
            auVar41._12_4_ = fVar136 * fVar136 * fVar136 * auVar191._12_4_ * -0.5;
            auVar41._16_4_ = fVar168 * fVar168 * fVar168 * -0.0;
            auVar41._20_4_ = fVar167 * fVar167 * fVar167 * -0.0;
            auVar41._24_4_ = fVar171 * fVar171 * fVar171 * -0.0;
            auVar41._28_4_ = auVar105._28_4_;
            auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar93 = vfmadd231ps_avx512vl(auVar41,auVar91,auVar93);
            auVar42._4_4_ = auVar105._4_4_ * auVar93._4_4_;
            auVar42._0_4_ = auVar105._0_4_ * auVar93._0_4_;
            auVar42._8_4_ = auVar105._8_4_ * auVar93._8_4_;
            auVar42._12_4_ = auVar105._12_4_ * auVar93._12_4_;
            auVar42._16_4_ = auVar105._16_4_ * auVar93._16_4_;
            auVar42._20_4_ = auVar105._20_4_ * auVar93._20_4_;
            auVar42._24_4_ = auVar105._24_4_ * auVar93._24_4_;
            auVar42._28_4_ = 0;
            auVar43._4_4_ = auVar93._4_4_ * -auVar104._4_4_;
            auVar43._0_4_ = auVar93._0_4_ * -auVar104._0_4_;
            auVar43._8_4_ = auVar93._8_4_ * -auVar104._8_4_;
            auVar43._12_4_ = auVar93._12_4_ * -auVar104._12_4_;
            auVar43._16_4_ = auVar93._16_4_ * -auVar104._16_4_;
            auVar43._20_4_ = auVar93._20_4_ * -auVar104._20_4_;
            auVar43._24_4_ = auVar93._24_4_ * -auVar104._24_4_;
            auVar43._28_4_ = auVar105._28_4_;
            auVar90 = vmulps_avx512vl(auVar93,auVar87);
            auVar93 = vfmadd213ps_avx512vl(auVar106,auVar106,auVar87);
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar107,auVar107);
            auVar89 = vrsqrt14ps_avx512vl(auVar93);
            auVar93 = vmulps_avx512vl(auVar93,auVar188);
            fVar124 = auVar89._0_4_;
            fVar149 = auVar89._4_4_;
            fVar135 = auVar89._8_4_;
            fVar136 = auVar89._12_4_;
            fVar168 = auVar89._16_4_;
            fVar167 = auVar89._20_4_;
            fVar171 = auVar89._24_4_;
            auVar44._4_4_ = fVar149 * fVar149 * fVar149 * auVar93._4_4_;
            auVar44._0_4_ = fVar124 * fVar124 * fVar124 * auVar93._0_4_;
            auVar44._8_4_ = fVar135 * fVar135 * fVar135 * auVar93._8_4_;
            auVar44._12_4_ = fVar136 * fVar136 * fVar136 * auVar93._12_4_;
            auVar44._16_4_ = fVar168 * fVar168 * fVar168 * auVar93._16_4_;
            auVar44._20_4_ = fVar167 * fVar167 * fVar167 * auVar93._20_4_;
            auVar44._24_4_ = fVar171 * fVar171 * fVar171 * auVar93._24_4_;
            auVar44._28_4_ = auVar93._28_4_;
            auVar93 = vfmadd231ps_avx512vl(auVar44,auVar91,auVar89);
            auVar45._4_4_ = auVar107._4_4_ * auVar93._4_4_;
            auVar45._0_4_ = auVar107._0_4_ * auVar93._0_4_;
            auVar45._8_4_ = auVar107._8_4_ * auVar93._8_4_;
            auVar45._12_4_ = auVar107._12_4_ * auVar93._12_4_;
            auVar45._16_4_ = auVar107._16_4_ * auVar93._16_4_;
            auVar45._20_4_ = auVar107._20_4_ * auVar93._20_4_;
            auVar45._24_4_ = auVar107._24_4_ * auVar93._24_4_;
            auVar45._28_4_ = auVar89._28_4_;
            auVar46._4_4_ = auVar93._4_4_ * auVar92._4_4_;
            auVar46._0_4_ = auVar93._0_4_ * auVar92._0_4_;
            auVar46._8_4_ = auVar93._8_4_ * auVar92._8_4_;
            auVar46._12_4_ = auVar93._12_4_ * auVar92._12_4_;
            auVar46._16_4_ = auVar93._16_4_ * auVar92._16_4_;
            auVar46._20_4_ = auVar93._20_4_ * auVar92._20_4_;
            auVar46._24_4_ = auVar93._24_4_ * auVar92._24_4_;
            auVar46._28_4_ = auVar92._28_4_;
            auVar92 = vmulps_avx512vl(auVar93,auVar87);
            auVar191 = vfmadd213ps_fma(auVar42,ZEXT1632(auVar74),auVar82);
            auVar93 = ZEXT1632(auVar74);
            auVar190 = vfmadd213ps_fma(auVar43,auVar93,auVar84);
            auVar91 = vfmadd213ps_avx512vl(auVar90,auVar93,auVar79);
            auVar89 = vfmadd213ps_avx512vl(auVar45,ZEXT1632(auVar73),auVar85);
            auVar23 = vfnmadd213ps_fma(auVar42,auVar93,auVar82);
            auVar80 = ZEXT1632(auVar73);
            auVar19 = vfmadd213ps_fma(auVar46,auVar80,auVar86);
            auVar75 = vfnmadd213ps_fma(auVar43,auVar93,auVar84);
            auVar20 = vfmadd213ps_fma(auVar92,auVar80,auVar78);
            auVar84 = ZEXT1632(auVar74);
            auVar28 = vfnmadd231ps_fma(auVar79,auVar84,auVar90);
            auVar76 = vfnmadd213ps_fma(auVar45,auVar80,auVar85);
            auVar27 = vfnmadd213ps_fma(auVar46,auVar80,auVar86);
            auVar77 = vfnmadd231ps_fma(auVar78,ZEXT1632(auVar73),auVar92);
            auVar78 = vsubps_avx512vl(auVar89,ZEXT1632(auVar23));
            auVar92 = vsubps_avx(ZEXT1632(auVar19),ZEXT1632(auVar75));
            auVar93 = vsubps_avx(ZEXT1632(auVar20),ZEXT1632(auVar28));
            auVar47._4_4_ = auVar92._4_4_ * auVar28._4_4_;
            auVar47._0_4_ = auVar92._0_4_ * auVar28._0_4_;
            auVar47._8_4_ = auVar92._8_4_ * auVar28._8_4_;
            auVar47._12_4_ = auVar92._12_4_ * auVar28._12_4_;
            auVar47._16_4_ = auVar92._16_4_ * 0.0;
            auVar47._20_4_ = auVar92._20_4_ * 0.0;
            auVar47._24_4_ = auVar92._24_4_ * 0.0;
            auVar47._28_4_ = auVar90._28_4_;
            auVar74 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar75),auVar93);
            auVar48._4_4_ = auVar93._4_4_ * auVar23._4_4_;
            auVar48._0_4_ = auVar93._0_4_ * auVar23._0_4_;
            auVar48._8_4_ = auVar93._8_4_ * auVar23._8_4_;
            auVar48._12_4_ = auVar93._12_4_ * auVar23._12_4_;
            auVar48._16_4_ = auVar93._16_4_ * 0.0;
            auVar48._20_4_ = auVar93._20_4_ * 0.0;
            auVar48._24_4_ = auVar93._24_4_ * 0.0;
            auVar48._28_4_ = auVar93._28_4_;
            auVar21 = vfmsub231ps_fma(auVar48,ZEXT1632(auVar28),auVar78);
            auVar49._4_4_ = auVar75._4_4_ * auVar78._4_4_;
            auVar49._0_4_ = auVar75._0_4_ * auVar78._0_4_;
            auVar49._8_4_ = auVar75._8_4_ * auVar78._8_4_;
            auVar49._12_4_ = auVar75._12_4_ * auVar78._12_4_;
            auVar49._16_4_ = auVar78._16_4_ * 0.0;
            auVar49._20_4_ = auVar78._20_4_ * 0.0;
            auVar49._24_4_ = auVar78._24_4_ * 0.0;
            auVar49._28_4_ = auVar78._28_4_;
            auVar22 = vfmsub231ps_fma(auVar49,ZEXT1632(auVar23),auVar92);
            auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar22),auVar87,ZEXT1632(auVar21));
            auVar92 = vfmadd231ps_avx512vl(auVar92,auVar87,ZEXT1632(auVar74));
            uVar60 = vcmpps_avx512vl(auVar92,auVar87,2);
            bVar59 = (byte)uVar60;
            fVar116 = (float)((uint)(bVar59 & 1) * auVar191._0_4_ |
                             (uint)!(bool)(bVar59 & 1) * auVar76._0_4_);
            bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
            fVar118 = (float)((uint)bVar13 * auVar191._4_4_ | (uint)!bVar13 * auVar76._4_4_);
            bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
            fVar120 = (float)((uint)bVar13 * auVar191._8_4_ | (uint)!bVar13 * auVar76._8_4_);
            bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
            fVar122 = (float)((uint)bVar13 * auVar191._12_4_ | (uint)!bVar13 * auVar76._12_4_);
            auVar80 = ZEXT1632(CONCAT412(fVar122,CONCAT48(fVar120,CONCAT44(fVar118,fVar116))));
            fVar117 = (float)((uint)(bVar59 & 1) * auVar190._0_4_ |
                             (uint)!(bool)(bVar59 & 1) * auVar27._0_4_);
            bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
            fVar119 = (float)((uint)bVar13 * auVar190._4_4_ | (uint)!bVar13 * auVar27._4_4_);
            bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
            fVar121 = (float)((uint)bVar13 * auVar190._8_4_ | (uint)!bVar13 * auVar27._8_4_);
            bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
            fVar123 = (float)((uint)bVar13 * auVar190._12_4_ | (uint)!bVar13 * auVar27._12_4_);
            auVar83 = ZEXT1632(CONCAT412(fVar123,CONCAT48(fVar121,CONCAT44(fVar119,fVar117))));
            auVar108._0_4_ =
                 (float)((uint)(bVar59 & 1) * auVar91._0_4_ |
                        (uint)!(bool)(bVar59 & 1) * auVar77._0_4_);
            bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar108._4_4_ = (float)((uint)bVar13 * auVar91._4_4_ | (uint)!bVar13 * auVar77._4_4_);
            bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar108._8_4_ = (float)((uint)bVar13 * auVar91._8_4_ | (uint)!bVar13 * auVar77._8_4_);
            bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar108._12_4_ =
                 (float)((uint)bVar13 * auVar91._12_4_ | (uint)!bVar13 * auVar77._12_4_);
            fVar124 = (float)((uint)((byte)(uVar60 >> 4) & 1) * auVar91._16_4_);
            auVar108._16_4_ = fVar124;
            fVar149 = (float)((uint)((byte)(uVar60 >> 5) & 1) * auVar91._20_4_);
            auVar108._20_4_ = fVar149;
            fVar135 = (float)((uint)((byte)(uVar60 >> 6) & 1) * auVar91._24_4_);
            auVar108._24_4_ = fVar135;
            iVar1 = (uint)(byte)(uVar60 >> 7) * auVar91._28_4_;
            auVar108._28_4_ = iVar1;
            auVar92 = vblendmps_avx512vl(ZEXT1632(auVar23),auVar89);
            auVar109._0_4_ =
                 (uint)(bVar59 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar74._0_4_;
            bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar109._4_4_ = (uint)bVar13 * auVar92._4_4_ | (uint)!bVar13 * auVar74._4_4_;
            bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar109._8_4_ = (uint)bVar13 * auVar92._8_4_ | (uint)!bVar13 * auVar74._8_4_;
            bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar109._12_4_ = (uint)bVar13 * auVar92._12_4_ | (uint)!bVar13 * auVar74._12_4_;
            auVar109._16_4_ = (uint)((byte)(uVar60 >> 4) & 1) * auVar92._16_4_;
            auVar109._20_4_ = (uint)((byte)(uVar60 >> 5) & 1) * auVar92._20_4_;
            auVar109._24_4_ = (uint)((byte)(uVar60 >> 6) & 1) * auVar92._24_4_;
            auVar109._28_4_ = (uint)(byte)(uVar60 >> 7) * auVar92._28_4_;
            auVar92 = vblendmps_avx512vl(ZEXT1632(auVar75),ZEXT1632(auVar19));
            auVar110._0_4_ =
                 (float)((uint)(bVar59 & 1) * auVar92._0_4_ |
                        (uint)!(bool)(bVar59 & 1) * auVar191._0_4_);
            bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar110._4_4_ = (float)((uint)bVar13 * auVar92._4_4_ | (uint)!bVar13 * auVar191._4_4_);
            bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar110._8_4_ = (float)((uint)bVar13 * auVar92._8_4_ | (uint)!bVar13 * auVar191._8_4_);
            bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar110._12_4_ =
                 (float)((uint)bVar13 * auVar92._12_4_ | (uint)!bVar13 * auVar191._12_4_);
            fVar167 = (float)((uint)((byte)(uVar60 >> 4) & 1) * auVar92._16_4_);
            auVar110._16_4_ = fVar167;
            fVar168 = (float)((uint)((byte)(uVar60 >> 5) & 1) * auVar92._20_4_);
            auVar110._20_4_ = fVar168;
            fVar136 = (float)((uint)((byte)(uVar60 >> 6) & 1) * auVar92._24_4_);
            auVar110._24_4_ = fVar136;
            auVar110._28_4_ = (uint)(byte)(uVar60 >> 7) * auVar92._28_4_;
            auVar92 = vblendmps_avx512vl(ZEXT1632(auVar28),ZEXT1632(auVar20));
            auVar111._0_4_ =
                 (float)((uint)(bVar59 & 1) * auVar92._0_4_ |
                        (uint)!(bool)(bVar59 & 1) * auVar190._0_4_);
            bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar111._4_4_ = (float)((uint)bVar13 * auVar92._4_4_ | (uint)!bVar13 * auVar190._4_4_);
            bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar111._8_4_ = (float)((uint)bVar13 * auVar92._8_4_ | (uint)!bVar13 * auVar190._8_4_);
            bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar111._12_4_ =
                 (float)((uint)bVar13 * auVar92._12_4_ | (uint)!bVar13 * auVar190._12_4_);
            fVar69 = (float)((uint)((byte)(uVar60 >> 4) & 1) * auVar92._16_4_);
            auVar111._16_4_ = fVar69;
            fVar68 = (float)((uint)((byte)(uVar60 >> 5) & 1) * auVar92._20_4_);
            auVar111._20_4_ = fVar68;
            fVar171 = (float)((uint)((byte)(uVar60 >> 6) & 1) * auVar92._24_4_);
            auVar111._24_4_ = fVar171;
            iVar2 = (uint)(byte)(uVar60 >> 7) * auVar92._28_4_;
            auVar111._28_4_ = iVar2;
            auVar112._0_4_ =
                 (uint)(bVar59 & 1) * (int)auVar23._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar89._0_4_
            ;
            bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar112._4_4_ = (uint)bVar13 * (int)auVar23._4_4_ | (uint)!bVar13 * auVar89._4_4_;
            bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar112._8_4_ = (uint)bVar13 * (int)auVar23._8_4_ | (uint)!bVar13 * auVar89._8_4_;
            bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar112._12_4_ = (uint)bVar13 * (int)auVar23._12_4_ | (uint)!bVar13 * auVar89._12_4_;
            auVar112._16_4_ = (uint)!(bool)((byte)(uVar60 >> 4) & 1) * auVar89._16_4_;
            auVar112._20_4_ = (uint)!(bool)((byte)(uVar60 >> 5) & 1) * auVar89._20_4_;
            auVar112._24_4_ = (uint)!(bool)((byte)(uVar60 >> 6) & 1) * auVar89._24_4_;
            auVar112._28_4_ = (uint)!SUB81(uVar60 >> 7,0) * auVar89._28_4_;
            bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar60 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar60 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar60 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar60 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar89 = vsubps_avx512vl(auVar112,auVar80);
            auVar93 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar75._12_4_ |
                                                    (uint)!bVar17 * auVar19._12_4_,
                                                    CONCAT48((uint)bVar15 * (int)auVar75._8_4_ |
                                                             (uint)!bVar15 * auVar19._8_4_,
                                                             CONCAT44((uint)bVar13 *
                                                                      (int)auVar75._4_4_ |
                                                                      (uint)!bVar13 * auVar19._4_4_,
                                                                      (uint)(bVar59 & 1) *
                                                                      (int)auVar75._0_4_ |
                                                                      (uint)!(bool)(bVar59 & 1) *
                                                                      auVar19._0_4_)))),auVar83);
            auVar91 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar28._12_4_ |
                                                    (uint)!bVar18 * auVar20._12_4_,
                                                    CONCAT48((uint)bVar16 * (int)auVar28._8_4_ |
                                                             (uint)!bVar16 * auVar20._8_4_,
                                                             CONCAT44((uint)bVar14 *
                                                                      (int)auVar28._4_4_ |
                                                                      (uint)!bVar14 * auVar20._4_4_,
                                                                      (uint)(bVar59 & 1) *
                                                                      (int)auVar28._0_4_ |
                                                                      (uint)!(bool)(bVar59 & 1) *
                                                                      auVar20._0_4_)))),auVar108);
            auVar90 = vsubps_avx(auVar80,auVar109);
            auVar78 = vsubps_avx(auVar83,auVar110);
            auVar79 = vsubps_avx(auVar108,auVar111);
            auVar50._4_4_ = auVar91._4_4_ * fVar118;
            auVar50._0_4_ = auVar91._0_4_ * fVar116;
            auVar50._8_4_ = auVar91._8_4_ * fVar120;
            auVar50._12_4_ = auVar91._12_4_ * fVar122;
            auVar50._16_4_ = auVar91._16_4_ * 0.0;
            auVar50._20_4_ = auVar91._20_4_ * 0.0;
            auVar50._24_4_ = auVar91._24_4_ * 0.0;
            auVar50._28_4_ = 0;
            auVar74 = vfmsub231ps_fma(auVar50,auVar108,auVar89);
            auVar155._0_4_ = fVar117 * auVar89._0_4_;
            auVar155._4_4_ = fVar119 * auVar89._4_4_;
            auVar155._8_4_ = fVar121 * auVar89._8_4_;
            auVar155._12_4_ = fVar123 * auVar89._12_4_;
            auVar155._16_4_ = auVar89._16_4_ * 0.0;
            auVar155._20_4_ = auVar89._20_4_ * 0.0;
            auVar155._24_4_ = auVar89._24_4_ * 0.0;
            auVar155._28_4_ = 0;
            auVar191 = vfmsub231ps_fma(auVar155,auVar80,auVar93);
            auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar191),auVar87,ZEXT1632(auVar74));
            auVar160._0_4_ = auVar93._0_4_ * auVar108._0_4_;
            auVar160._4_4_ = auVar93._4_4_ * auVar108._4_4_;
            auVar160._8_4_ = auVar93._8_4_ * auVar108._8_4_;
            auVar160._12_4_ = auVar93._12_4_ * auVar108._12_4_;
            auVar160._16_4_ = auVar93._16_4_ * fVar124;
            auVar160._20_4_ = auVar93._20_4_ * fVar149;
            auVar160._24_4_ = auVar93._24_4_ * fVar135;
            auVar160._28_4_ = 0;
            auVar74 = vfmsub231ps_fma(auVar160,auVar83,auVar91);
            auVar81 = vfmadd231ps_avx512vl(auVar92,auVar87,ZEXT1632(auVar74));
            auVar92 = vmulps_avx512vl(auVar79,auVar109);
            auVar92 = vfmsub231ps_avx512vl(auVar92,auVar90,auVar111);
            auVar51._4_4_ = auVar78._4_4_ * auVar111._4_4_;
            auVar51._0_4_ = auVar78._0_4_ * auVar111._0_4_;
            auVar51._8_4_ = auVar78._8_4_ * auVar111._8_4_;
            auVar51._12_4_ = auVar78._12_4_ * auVar111._12_4_;
            auVar51._16_4_ = auVar78._16_4_ * fVar69;
            auVar51._20_4_ = auVar78._20_4_ * fVar68;
            auVar51._24_4_ = auVar78._24_4_ * fVar171;
            auVar51._28_4_ = iVar2;
            auVar74 = vfmsub231ps_fma(auVar51,auVar110,auVar79);
            auVar161._0_4_ = auVar110._0_4_ * auVar90._0_4_;
            auVar161._4_4_ = auVar110._4_4_ * auVar90._4_4_;
            auVar161._8_4_ = auVar110._8_4_ * auVar90._8_4_;
            auVar161._12_4_ = auVar110._12_4_ * auVar90._12_4_;
            auVar161._16_4_ = fVar167 * auVar90._16_4_;
            auVar161._20_4_ = fVar168 * auVar90._20_4_;
            auVar161._24_4_ = fVar136 * auVar90._24_4_;
            auVar161._28_4_ = 0;
            auVar191 = vfmsub231ps_fma(auVar161,auVar78,auVar109);
            auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar191),auVar87,auVar92);
            auVar82 = vfmadd231ps_avx512vl(auVar92,auVar87,ZEXT1632(auVar74));
            auVar92 = vmaxps_avx(auVar81,auVar82);
            uVar137 = vcmpps_avx512vl(auVar92,auVar87,2);
            bVar67 = bVar67 & (byte)uVar137;
            if (bVar67 != 0) {
              uVar125 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar185._4_4_ = uVar125;
              auVar185._0_4_ = uVar125;
              auVar185._8_4_ = uVar125;
              auVar185._12_4_ = uVar125;
              auVar185._16_4_ = uVar125;
              auVar185._20_4_ = uVar125;
              auVar185._24_4_ = uVar125;
              auVar185._28_4_ = uVar125;
              auVar180 = ZEXT3264(auVar185);
              auVar52._4_4_ = auVar79._4_4_ * auVar93._4_4_;
              auVar52._0_4_ = auVar79._0_4_ * auVar93._0_4_;
              auVar52._8_4_ = auVar79._8_4_ * auVar93._8_4_;
              auVar52._12_4_ = auVar79._12_4_ * auVar93._12_4_;
              auVar52._16_4_ = auVar79._16_4_ * auVar93._16_4_;
              auVar52._20_4_ = auVar79._20_4_ * auVar93._20_4_;
              auVar52._24_4_ = auVar79._24_4_ * auVar93._24_4_;
              auVar52._28_4_ = auVar92._28_4_;
              auVar190 = vfmsub231ps_fma(auVar52,auVar78,auVar91);
              auVar53._4_4_ = auVar91._4_4_ * auVar90._4_4_;
              auVar53._0_4_ = auVar91._0_4_ * auVar90._0_4_;
              auVar53._8_4_ = auVar91._8_4_ * auVar90._8_4_;
              auVar53._12_4_ = auVar91._12_4_ * auVar90._12_4_;
              auVar53._16_4_ = auVar91._16_4_ * auVar90._16_4_;
              auVar53._20_4_ = auVar91._20_4_ * auVar90._20_4_;
              auVar53._24_4_ = auVar91._24_4_ * auVar90._24_4_;
              auVar53._28_4_ = auVar91._28_4_;
              auVar191 = vfmsub231ps_fma(auVar53,auVar89,auVar79);
              auVar54._4_4_ = auVar78._4_4_ * auVar89._4_4_;
              auVar54._0_4_ = auVar78._0_4_ * auVar89._0_4_;
              auVar54._8_4_ = auVar78._8_4_ * auVar89._8_4_;
              auVar54._12_4_ = auVar78._12_4_ * auVar89._12_4_;
              auVar54._16_4_ = auVar78._16_4_ * auVar89._16_4_;
              auVar54._20_4_ = auVar78._20_4_ * auVar89._20_4_;
              auVar54._24_4_ = auVar78._24_4_ * auVar89._24_4_;
              auVar54._28_4_ = auVar78._28_4_;
              auVar19 = vfmsub231ps_fma(auVar54,auVar90,auVar93);
              auVar74 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar191),ZEXT1632(auVar19));
              auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),ZEXT1632(auVar190),auVar87);
              auVar93 = vrcp14ps_avx512vl(auVar92);
              auVar90 = auVar134._0_32_;
              auVar91 = vfnmadd213ps_avx512vl(auVar93,auVar92,auVar90);
              auVar74 = vfmadd132ps_fma(auVar91,auVar93,auVar93);
              auVar55._4_4_ = auVar19._4_4_ * auVar108._4_4_;
              auVar55._0_4_ = auVar19._0_4_ * auVar108._0_4_;
              auVar55._8_4_ = auVar19._8_4_ * auVar108._8_4_;
              auVar55._12_4_ = auVar19._12_4_ * auVar108._12_4_;
              auVar55._16_4_ = fVar124 * 0.0;
              auVar55._20_4_ = fVar149 * 0.0;
              auVar55._24_4_ = fVar135 * 0.0;
              auVar55._28_4_ = iVar1;
              auVar191 = vfmadd231ps_fma(auVar55,auVar83,ZEXT1632(auVar191));
              auVar191 = vfmadd231ps_fma(ZEXT1632(auVar191),auVar80,ZEXT1632(auVar190));
              fVar124 = auVar74._0_4_;
              fVar149 = auVar74._4_4_;
              fVar135 = auVar74._8_4_;
              fVar136 = auVar74._12_4_;
              local_620 = ZEXT1632(CONCAT412(auVar191._12_4_ * fVar136,
                                             CONCAT48(auVar191._8_4_ * fVar135,
                                                      CONCAT44(auVar191._4_4_ * fVar149,
                                                               auVar191._0_4_ * fVar124))));
              uVar137 = vcmpps_avx512vl(local_620,auVar185,2);
              auVar57._4_4_ = uStack_71c;
              auVar57._0_4_ = local_720;
              auVar57._8_4_ = uStack_718;
              auVar57._12_4_ = uStack_714;
              auVar57._16_4_ = uStack_710;
              auVar57._20_4_ = uStack_70c;
              auVar57._24_4_ = uStack_708;
              auVar57._28_4_ = uStack_704;
              uVar24 = vcmpps_avx512vl(local_620,auVar57,0xd);
              bVar67 = (byte)uVar137 & (byte)uVar24 & bVar67;
              if (bVar67 != 0) {
                uVar137 = vcmpps_avx512vl(auVar92,auVar87,4);
                bVar67 = bVar67 & (byte)uVar137;
                if (bVar67 != 0) {
                  fVar168 = auVar81._0_4_ * fVar124;
                  fVar167 = auVar81._4_4_ * fVar149;
                  auVar56._4_4_ = fVar167;
                  auVar56._0_4_ = fVar168;
                  fVar171 = auVar81._8_4_ * fVar135;
                  auVar56._8_4_ = fVar171;
                  fVar68 = auVar81._12_4_ * fVar136;
                  auVar56._12_4_ = fVar68;
                  fVar69 = auVar81._16_4_ * 0.0;
                  auVar56._16_4_ = fVar69;
                  fVar116 = auVar81._20_4_ * 0.0;
                  auVar56._20_4_ = fVar116;
                  fVar117 = auVar81._24_4_ * 0.0;
                  auVar56._24_4_ = fVar117;
                  auVar56._28_4_ = auVar92._28_4_;
                  auVar93 = vsubps_avx512vl(auVar90,auVar56);
                  local_660._0_4_ =
                       (float)((uint)(bVar59 & 1) * (int)fVar168 |
                              (uint)!(bool)(bVar59 & 1) * auVar93._0_4_);
                  bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
                  local_660._4_4_ =
                       (float)((uint)bVar13 * (int)fVar167 | (uint)!bVar13 * auVar93._4_4_);
                  bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
                  local_660._8_4_ =
                       (float)((uint)bVar13 * (int)fVar171 | (uint)!bVar13 * auVar93._8_4_);
                  bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
                  local_660._12_4_ =
                       (float)((uint)bVar13 * (int)fVar68 | (uint)!bVar13 * auVar93._12_4_);
                  bVar13 = (bool)((byte)(uVar60 >> 4) & 1);
                  local_660._16_4_ =
                       (float)((uint)bVar13 * (int)fVar69 | (uint)!bVar13 * auVar93._16_4_);
                  bVar13 = (bool)((byte)(uVar60 >> 5) & 1);
                  local_660._20_4_ =
                       (float)((uint)bVar13 * (int)fVar116 | (uint)!bVar13 * auVar93._20_4_);
                  bVar13 = (bool)((byte)(uVar60 >> 6) & 1);
                  local_660._24_4_ =
                       (float)((uint)bVar13 * (int)fVar117 | (uint)!bVar13 * auVar93._24_4_);
                  bVar13 = SUB81(uVar60 >> 7,0);
                  local_660._28_4_ =
                       (float)((uint)bVar13 * auVar92._28_4_ | (uint)!bVar13 * auVar93._28_4_);
                  auVar92 = vsubps_avx(ZEXT1632(auVar73),auVar84);
                  auVar74 = vfmadd213ps_fma(auVar92,local_660,auVar84);
                  uVar125 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
                  auVar32._4_4_ = uVar125;
                  auVar32._0_4_ = uVar125;
                  auVar32._8_4_ = uVar125;
                  auVar32._12_4_ = uVar125;
                  auVar32._16_4_ = uVar125;
                  auVar32._20_4_ = uVar125;
                  auVar32._24_4_ = uVar125;
                  auVar32._28_4_ = uVar125;
                  auVar92 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar74._12_4_ + auVar74._12_4_,
                                                               CONCAT48(auVar74._8_4_ +
                                                                        auVar74._8_4_,
                                                                        CONCAT44(auVar74._4_4_ +
                                                                                 auVar74._4_4_,
                                                                                 auVar74._0_4_ +
                                                                                 auVar74._0_4_)))),
                                            auVar32);
                  uVar137 = vcmpps_avx512vl(local_620,auVar92,6);
                  if (((byte)uVar137 & bVar67) != 0) {
                    auVar143._0_4_ = auVar82._0_4_ * fVar124;
                    auVar143._4_4_ = auVar82._4_4_ * fVar149;
                    auVar143._8_4_ = auVar82._8_4_ * fVar135;
                    auVar143._12_4_ = auVar82._12_4_ * fVar136;
                    auVar143._16_4_ = auVar82._16_4_ * 0.0;
                    auVar143._20_4_ = auVar82._20_4_ * 0.0;
                    auVar143._24_4_ = auVar82._24_4_ * 0.0;
                    auVar143._28_4_ = 0;
                    auVar92 = vsubps_avx512vl(auVar90,auVar143);
                    auVar113._0_4_ =
                         (uint)(bVar59 & 1) * (int)auVar143._0_4_ |
                         (uint)!(bool)(bVar59 & 1) * auVar92._0_4_;
                    bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
                    auVar113._4_4_ =
                         (uint)bVar13 * (int)auVar143._4_4_ | (uint)!bVar13 * auVar92._4_4_;
                    bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
                    auVar113._8_4_ =
                         (uint)bVar13 * (int)auVar143._8_4_ | (uint)!bVar13 * auVar92._8_4_;
                    bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
                    auVar113._12_4_ =
                         (uint)bVar13 * (int)auVar143._12_4_ | (uint)!bVar13 * auVar92._12_4_;
                    bVar13 = (bool)((byte)(uVar60 >> 4) & 1);
                    auVar113._16_4_ =
                         (uint)bVar13 * (int)auVar143._16_4_ | (uint)!bVar13 * auVar92._16_4_;
                    bVar13 = (bool)((byte)(uVar60 >> 5) & 1);
                    auVar113._20_4_ =
                         (uint)bVar13 * (int)auVar143._20_4_ | (uint)!bVar13 * auVar92._20_4_;
                    bVar13 = (bool)((byte)(uVar60 >> 6) & 1);
                    auVar113._24_4_ =
                         (uint)bVar13 * (int)auVar143._24_4_ | (uint)!bVar13 * auVar92._24_4_;
                    auVar113._28_4_ = (uint)!SUB81(uVar60 >> 7,0) * auVar92._28_4_;
                    auVar33._8_4_ = 0x40000000;
                    auVar33._0_8_ = 0x4000000040000000;
                    auVar33._12_4_ = 0x40000000;
                    auVar33._16_4_ = 0x40000000;
                    auVar33._20_4_ = 0x40000000;
                    auVar33._24_4_ = 0x40000000;
                    auVar33._28_4_ = 0x40000000;
                    local_640 = vfmsub132ps_avx512vl(auVar113,auVar90,auVar33);
                    local_600 = (undefined4)lVar65;
                    local_5f0 = local_8c0._0_8_;
                    uStack_5e8 = local_8c0._8_8_;
                    local_5e0 = local_8d0._0_8_;
                    uStack_5d8 = local_8d0._8_8_;
                    local_5d0 = local_8e0._0_8_;
                    uStack_5c8 = local_8e0._8_8_;
                    pGVar9 = (context->scene->geometries).items[uVar7].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                      bVar59 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar59 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar74 = vcvtsi2ss_avx512f(auVar88._0_16_,local_600);
                      fVar124 = auVar74._0_4_;
                      local_5a0[0] = (fVar124 + local_660._0_4_ + 0.0) * (float)local_440._0_4_;
                      local_5a0[1] = (fVar124 + local_660._4_4_ + 1.0) * (float)local_440._4_4_;
                      local_5a0[2] = (fVar124 + local_660._8_4_ + 2.0) * fStack_438;
                      local_5a0[3] = (fVar124 + local_660._12_4_ + 3.0) * fStack_434;
                      fStack_590 = (fVar124 + local_660._16_4_ + 4.0) * fStack_430;
                      fStack_58c = (fVar124 + local_660._20_4_ + 5.0) * fStack_42c;
                      fStack_588 = (fVar124 + local_660._24_4_ + 6.0) * fStack_428;
                      fStack_584 = fVar124 + local_660._28_4_ + 7.0;
                      local_580 = local_640;
                      local_560 = local_620;
                      uVar60 = CONCAT71(0,(byte)uVar137 & bVar67);
                      local_940._0_8_ = uVar60;
                      lVar11 = 0;
                      for (; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
                        lVar11 = lVar11 + 1;
                      }
                      local_540._0_8_ = lVar11;
                      local_7a0._0_4_ = (int)uVar62;
                      local_4e0 = auVar185;
                      local_5fc = iVar8;
                      do {
                        auVar191 = auVar192._0_16_;
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_5a0[local_540._0_8_]));
                        local_1c0 = vbroadcastss_avx512f
                                              (ZEXT416(*(uint *)(local_580 + local_540._0_8_ * 4)));
                        *(undefined4 *)(ray + k * 4 + 0x200) =
                             *(undefined4 *)(local_560 + local_540._0_8_ * 4);
                        local_910.context = context->user;
                        fVar136 = local_200._0_4_;
                        fVar149 = 1.0 - fVar136;
                        fVar124 = fVar149 * fVar149 * -3.0;
                        auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar149 * fVar149)),
                                                  ZEXT416((uint)(fVar136 * fVar149)),
                                                  ZEXT416(0xc0000000));
                        auVar73 = vfmsub132ss_fma(ZEXT416((uint)(fVar136 * fVar149)),
                                                  ZEXT416((uint)(fVar136 * fVar136)),
                                                  ZEXT416(0x40000000));
                        fVar149 = auVar74._0_4_ * 3.0;
                        fVar135 = auVar73._0_4_ * 3.0;
                        fVar136 = fVar136 * fVar136 * 3.0;
                        auVar166._0_4_ = fVar136 * (float)local_730._0_4_;
                        auVar166._4_4_ = fVar136 * (float)local_730._4_4_;
                        auVar166._8_4_ = fVar136 * fStack_728;
                        auVar166._12_4_ = fVar136 * fStack_724;
                        auVar132._4_4_ = fVar135;
                        auVar132._0_4_ = fVar135;
                        auVar132._8_4_ = fVar135;
                        auVar132._12_4_ = fVar135;
                        auVar74 = vfmadd132ps_fma(auVar132,auVar166,local_8e0);
                        auVar153._4_4_ = fVar149;
                        auVar153._0_4_ = fVar149;
                        auVar153._8_4_ = fVar149;
                        auVar153._12_4_ = fVar149;
                        auVar74 = vfmadd132ps_fma(auVar153,auVar74,local_8d0);
                        auVar133._4_4_ = fVar124;
                        auVar133._0_4_ = fVar124;
                        auVar133._8_4_ = fVar124;
                        auVar133._12_4_ = fVar124;
                        auVar74 = vfmadd132ps_fma(auVar133,auVar74,local_8c0);
                        auVar134 = vbroadcastss_avx512f(auVar74);
                        auVar189 = vbroadcastss_avx512f(ZEXT416(1));
                        local_280 = vpermps_avx512f(auVar189,ZEXT1664(auVar74));
                        auVar189 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar189,ZEXT1664(auVar74));
                        local_2c0[0] = (RTCHitN)auVar134[0];
                        local_2c0[1] = (RTCHitN)auVar134[1];
                        local_2c0[2] = (RTCHitN)auVar134[2];
                        local_2c0[3] = (RTCHitN)auVar134[3];
                        local_2c0[4] = (RTCHitN)auVar134[4];
                        local_2c0[5] = (RTCHitN)auVar134[5];
                        local_2c0[6] = (RTCHitN)auVar134[6];
                        local_2c0[7] = (RTCHitN)auVar134[7];
                        local_2c0[8] = (RTCHitN)auVar134[8];
                        local_2c0[9] = (RTCHitN)auVar134[9];
                        local_2c0[10] = (RTCHitN)auVar134[10];
                        local_2c0[0xb] = (RTCHitN)auVar134[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar134[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar134[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar134[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar134[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar134[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar134[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar134[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar134[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar134[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar134[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar134[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar134[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar134[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar134[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar134[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar134[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar134[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar134[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar134[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar134[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar134[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar134[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar134[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar134[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar134[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar134[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar134[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar134[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar134[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar134[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar134[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar134[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar134[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar134[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar134[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar134[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar134[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar134[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar134[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar134[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar134[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar134[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar134[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar134[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar134[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar134[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar134[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar134[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar134[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar134[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar134[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar134[0x3f];
                        local_180 = local_480._0_8_;
                        uStack_178 = local_480._8_8_;
                        uStack_170 = local_480._16_8_;
                        uStack_168 = local_480._24_8_;
                        uStack_160 = local_480._32_8_;
                        uStack_158 = local_480._40_8_;
                        uStack_150 = local_480._48_8_;
                        uStack_148 = local_480._56_8_;
                        auVar134 = vmovdqa64_avx512f(local_4c0);
                        local_140 = vmovdqa64_avx512f(auVar134);
                        vpcmpeqd_avx2(auVar134._0_32_,auVar134._0_32_);
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_910.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_910.context)->instPrimID[0]))
                        ;
                        auVar134 = vmovdqa64_avx512f(local_300);
                        local_700 = vmovdqa64_avx512f(auVar134);
                        local_910.valid = (int *)local_700;
                        local_910.geometryUserPtr = pGVar9->userPtr;
                        local_910.hit = local_2c0;
                        local_910.N = 0x10;
                        local_910.ray = (RTCRayN *)ray;
                        if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar9->occlusionFilterN)(&local_910);
                          auVar180 = ZEXT3264(local_4e0);
                          uVar62 = (ulong)(uint)local_7a0._0_4_;
                          auVar199 = ZEXT3264(local_780);
                          auVar200 = ZEXT3264(local_880);
                          auVar198 = ZEXT3264(local_840);
                          auVar197 = ZEXT3264(local_820);
                          auVar196 = ZEXT3264(local_800);
                          auVar195 = ZEXT3264(local_7e0);
                          auVar194 = ZEXT3264(local_760);
                          auVar193 = ZEXT3264(local_7c0);
                          auVar74 = vxorps_avx512vl(auVar191,auVar191);
                          auVar192 = ZEXT1664(auVar74);
                          auVar134 = vmovdqa64_avx512f(local_700);
                        }
                        auVar74 = auVar192._0_16_;
                        uVar137 = vptestmd_avx512f(auVar134,auVar134);
                        if ((short)uVar137 == 0) {
                          auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar134 = ZEXT3264(auVar92);
                        }
                        else {
                          p_Var12 = context->args->filter;
                          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var12)(&local_910);
                            auVar180 = ZEXT3264(local_4e0);
                            uVar62 = (ulong)(uint)local_7a0._0_4_;
                            auVar199 = ZEXT3264(local_780);
                            auVar200 = ZEXT3264(local_880);
                            auVar198 = ZEXT3264(local_840);
                            auVar197 = ZEXT3264(local_820);
                            auVar196 = ZEXT3264(local_800);
                            auVar195 = ZEXT3264(local_7e0);
                            auVar194 = ZEXT3264(local_760);
                            auVar193 = ZEXT3264(local_7c0);
                            auVar74 = vxorps_avx512vl(auVar74,auVar74);
                            auVar192 = ZEXT1664(auVar74);
                            auVar134 = vmovdqa64_avx512f(local_700);
                          }
                          uVar60 = vptestmd_avx512f(auVar134,auVar134);
                          auVar134 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                          bVar13 = (bool)((byte)uVar60 & 1);
                          auVar189._0_4_ =
                               (uint)bVar13 * auVar134._0_4_ |
                               (uint)!bVar13 * *(int *)(local_910.ray + 0x200);
                          bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
                          auVar189._4_4_ =
                               (uint)bVar13 * auVar134._4_4_ |
                               (uint)!bVar13 * *(int *)(local_910.ray + 0x204);
                          bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
                          auVar189._8_4_ =
                               (uint)bVar13 * auVar134._8_4_ |
                               (uint)!bVar13 * *(int *)(local_910.ray + 0x208);
                          bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
                          auVar189._12_4_ =
                               (uint)bVar13 * auVar134._12_4_ |
                               (uint)!bVar13 * *(int *)(local_910.ray + 0x20c);
                          bVar13 = (bool)((byte)(uVar60 >> 4) & 1);
                          auVar189._16_4_ =
                               (uint)bVar13 * auVar134._16_4_ |
                               (uint)!bVar13 * *(int *)(local_910.ray + 0x210);
                          bVar13 = (bool)((byte)(uVar60 >> 5) & 1);
                          auVar189._20_4_ =
                               (uint)bVar13 * auVar134._20_4_ |
                               (uint)!bVar13 * *(int *)(local_910.ray + 0x214);
                          bVar13 = (bool)((byte)(uVar60 >> 6) & 1);
                          auVar189._24_4_ =
                               (uint)bVar13 * auVar134._24_4_ |
                               (uint)!bVar13 * *(int *)(local_910.ray + 0x218);
                          bVar13 = (bool)((byte)(uVar60 >> 7) & 1);
                          auVar189._28_4_ =
                               (uint)bVar13 * auVar134._28_4_ |
                               (uint)!bVar13 * *(int *)(local_910.ray + 0x21c);
                          bVar13 = (bool)((byte)(uVar60 >> 8) & 1);
                          auVar189._32_4_ =
                               (uint)bVar13 * auVar134._32_4_ |
                               (uint)!bVar13 * *(int *)(local_910.ray + 0x220);
                          bVar13 = (bool)((byte)(uVar60 >> 9) & 1);
                          auVar189._36_4_ =
                               (uint)bVar13 * auVar134._36_4_ |
                               (uint)!bVar13 * *(int *)(local_910.ray + 0x224);
                          bVar13 = (bool)((byte)(uVar60 >> 10) & 1);
                          auVar189._40_4_ =
                               (uint)bVar13 * auVar134._40_4_ |
                               (uint)!bVar13 * *(int *)(local_910.ray + 0x228);
                          bVar13 = (bool)((byte)(uVar60 >> 0xb) & 1);
                          auVar189._44_4_ =
                               (uint)bVar13 * auVar134._44_4_ |
                               (uint)!bVar13 * *(int *)(local_910.ray + 0x22c);
                          bVar13 = (bool)((byte)(uVar60 >> 0xc) & 1);
                          auVar189._48_4_ =
                               (uint)bVar13 * auVar134._48_4_ |
                               (uint)!bVar13 * *(int *)(local_910.ray + 0x230);
                          bVar13 = (bool)((byte)(uVar60 >> 0xd) & 1);
                          auVar189._52_4_ =
                               (uint)bVar13 * auVar134._52_4_ |
                               (uint)!bVar13 * *(int *)(local_910.ray + 0x234);
                          bVar13 = (bool)((byte)(uVar60 >> 0xe) & 1);
                          auVar189._56_4_ =
                               (uint)bVar13 * auVar134._56_4_ |
                               (uint)!bVar13 * *(int *)(local_910.ray + 0x238);
                          bVar13 = SUB81(uVar60 >> 0xf,0);
                          auVar189._60_4_ =
                               (uint)bVar13 * auVar134._60_4_ |
                               (uint)!bVar13 * *(int *)(local_910.ray + 0x23c);
                          *(undefined1 (*) [64])(local_910.ray + 0x200) = auVar189;
                          auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar134 = ZEXT3264(auVar92);
                          if ((short)uVar60 != 0) {
                            bVar59 = 1;
                            break;
                          }
                        }
                        *(int *)(ray + k * 4 + 0x200) = auVar180._0_4_;
                        uVar63 = local_940._0_8_ ^ 1L << (local_540._0_8_ & 0x3f);
                        bVar59 = 0;
                        local_940._0_8_ = uVar63;
                        lVar11 = 0;
                        for (uVar60 = uVar63; (uVar60 & 1) == 0;
                            uVar60 = uVar60 >> 1 | 0x8000000000000000) {
                          lVar11 = lVar11 + 1;
                        }
                        local_540._0_8_ = lVar11;
                      } while (uVar63 != 0);
                    }
                    uVar62 = CONCAT71((int7)(uVar62 >> 8),(byte)uVar62 | bVar59);
                  }
                }
              }
            }
          }
          lVar65 = lVar65 + 8;
        } while ((int)lVar65 < iVar8);
      }
      bVar67 = (byte)uVar62;
      if ((uVar62 & 1) != 0) break;
      uVar125 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar30._4_4_ = uVar125;
      auVar30._0_4_ = uVar125;
      auVar30._8_4_ = uVar125;
      auVar30._12_4_ = uVar125;
      uVar137 = vcmpps_avx512vl(local_670,auVar30,2);
      uVar64 = (uint)uVar66 & (uint)uVar66 + 0xf & (uint)uVar137;
      uVar66 = (ulong)uVar64;
    } while (uVar64 != 0);
  }
  return (bool)(bVar67 & 1);
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }